

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  Primitive *pPVar81;
  undefined8 in_R10;
  bool bVar82;
  ulong uVar83;
  uint uVar84;
  uint uVar135;
  uint uVar136;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  uint uVar137;
  uint uVar141;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float pp;
  float fVar142;
  float fVar143;
  undefined4 uVar144;
  float fVar159;
  float fVar160;
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar146 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar181;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar232;
  undefined1 auVar230 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar231 [64];
  undefined1 auVar233 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  float fVar243;
  float fVar244;
  undefined1 auVar239 [16];
  float fVar245;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  float fVar250;
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_94c;
  int local_93c;
  RayQueryContext *local_938;
  undefined4 local_92c;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  uint local_768;
  uint local_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [16];
  undefined8 local_630;
  undefined4 local_628;
  float local_624;
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  uint local_614;
  uint local_610;
  Primitive *local_600;
  Primitive *local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined1 auStack_530 [16];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [16];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_350 [16];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar125 [32];
  
  uVar83 = (ulong)(byte)prim[1];
  pPVar81 = prim + uVar83 * 0x19 + 0x16;
  fVar202 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar91 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  fVar179 = fVar202 * auVar91._0_4_;
  fVar142 = fVar202 * (ray->dir).field_0.m128[0];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar83 * 4 + 6);
  auVar99 = vpmovsxbd_avx2(auVar87);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar83 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar88);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar83 * 6 + 6);
  auVar101 = vpmovsxbd_avx2(auVar92);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar102 = vpmovsxbd_avx2(auVar93);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar83 * 0xc + 6);
  auVar103 = vpmovsxbd_avx2(auVar85);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar107 = vpmovsxbd_avx2(auVar89);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar100 = vpmovsxbd_avx2(auVar86);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 * 0x13 + 6);
  auVar106 = vpmovsxbd_avx2(auVar94);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar83 * 0x14 + 6);
  auVar97 = vpmovsxbd_avx2(auVar90);
  auVar104 = vcvtdq2ps_avx(auVar106);
  auVar105 = vcvtdq2ps_avx(auVar97);
  auVar254 = ZEXT3264(auVar105);
  auVar118._4_4_ = fVar142;
  auVar118._0_4_ = fVar142;
  auVar118._8_4_ = fVar142;
  auVar118._12_4_ = fVar142;
  auVar118._16_4_ = fVar142;
  auVar118._20_4_ = fVar142;
  auVar118._24_4_ = fVar142;
  auVar118._28_4_ = fVar142;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  auVar109 = ZEXT1632(CONCAT412(fVar202 * (ray->dir).field_0.m128[3],
                                CONCAT48(fVar202 * (ray->dir).field_0.m128[2],
                                         CONCAT44(fVar202 * (ray->dir).field_0.m128[1],fVar142))));
  auVar108 = vpermps_avx2(auVar120,auVar109);
  auVar95 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar96 = vpermps_avx512vl(auVar95,auVar109);
  fVar142 = auVar96._0_4_;
  fVar243 = auVar96._4_4_;
  auVar109._4_4_ = fVar243 * auVar101._4_4_;
  auVar109._0_4_ = fVar142 * auVar101._0_4_;
  fVar244 = auVar96._8_4_;
  auVar109._8_4_ = fVar244 * auVar101._8_4_;
  fVar245 = auVar96._12_4_;
  auVar109._12_4_ = fVar245 * auVar101._12_4_;
  fVar220 = auVar96._16_4_;
  auVar109._16_4_ = fVar220 * auVar101._16_4_;
  fVar221 = auVar96._20_4_;
  auVar109._20_4_ = fVar221 * auVar101._20_4_;
  fVar164 = auVar96._24_4_;
  auVar109._24_4_ = fVar164 * auVar101._24_4_;
  auVar109._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar107._4_4_ * fVar243;
  auVar97._0_4_ = auVar107._0_4_ * fVar142;
  auVar97._8_4_ = auVar107._8_4_ * fVar244;
  auVar97._12_4_ = auVar107._12_4_ * fVar245;
  auVar97._16_4_ = auVar107._16_4_ * fVar220;
  auVar97._20_4_ = auVar107._20_4_ * fVar221;
  auVar97._24_4_ = auVar107._24_4_ * fVar164;
  auVar97._28_4_ = auVar106._28_4_;
  auVar106._4_4_ = auVar105._4_4_ * fVar243;
  auVar106._0_4_ = auVar105._0_4_ * fVar142;
  auVar106._8_4_ = auVar105._8_4_ * fVar244;
  auVar106._12_4_ = auVar105._12_4_ * fVar245;
  auVar106._16_4_ = auVar105._16_4_ * fVar220;
  auVar106._20_4_ = auVar105._20_4_ * fVar221;
  auVar106._24_4_ = auVar105._24_4_ * fVar164;
  auVar106._28_4_ = auVar96._28_4_;
  auVar87 = vfmadd231ps_fma(auVar109,auVar108,auVar98);
  auVar88 = vfmadd231ps_fma(auVar97,auVar108,auVar103);
  auVar92 = vfmadd231ps_fma(auVar106,auVar104,auVar108);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar118,auVar99);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar118,auVar102);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar100,auVar118);
  auVar119._4_4_ = fVar179;
  auVar119._0_4_ = fVar179;
  auVar119._8_4_ = fVar179;
  auVar119._12_4_ = fVar179;
  auVar119._16_4_ = fVar179;
  auVar119._20_4_ = fVar179;
  auVar119._24_4_ = fVar179;
  auVar119._28_4_ = fVar179;
  auVar97 = ZEXT1632(CONCAT412(fVar202 * auVar91._12_4_,
                               CONCAT48(fVar202 * auVar91._8_4_,
                                        CONCAT44(fVar202 * auVar91._4_4_,fVar179))));
  auVar106 = vpermps_avx2(auVar120,auVar97);
  auVar97 = vpermps_avx512vl(auVar95,auVar97);
  fVar202 = auVar97._0_4_;
  fVar142 = auVar97._4_4_;
  auVar108._4_4_ = fVar142 * auVar101._4_4_;
  auVar108._0_4_ = fVar202 * auVar101._0_4_;
  fVar243 = auVar97._8_4_;
  auVar108._8_4_ = fVar243 * auVar101._8_4_;
  fVar244 = auVar97._12_4_;
  auVar108._12_4_ = fVar244 * auVar101._12_4_;
  fVar245 = auVar97._16_4_;
  auVar108._16_4_ = fVar245 * auVar101._16_4_;
  fVar220 = auVar97._20_4_;
  auVar108._20_4_ = fVar220 * auVar101._20_4_;
  fVar221 = auVar97._24_4_;
  auVar108._24_4_ = fVar221 * auVar101._24_4_;
  auVar108._28_4_ = 1;
  auVar95._4_4_ = auVar107._4_4_ * fVar142;
  auVar95._0_4_ = auVar107._0_4_ * fVar202;
  auVar95._8_4_ = auVar107._8_4_ * fVar243;
  auVar95._12_4_ = auVar107._12_4_ * fVar244;
  auVar95._16_4_ = auVar107._16_4_ * fVar245;
  auVar95._20_4_ = auVar107._20_4_ * fVar220;
  auVar95._24_4_ = auVar107._24_4_ * fVar221;
  auVar95._28_4_ = auVar101._28_4_;
  auVar107._4_4_ = auVar105._4_4_ * fVar142;
  auVar107._0_4_ = auVar105._0_4_ * fVar202;
  auVar107._8_4_ = auVar105._8_4_ * fVar243;
  auVar107._12_4_ = auVar105._12_4_ * fVar244;
  auVar107._16_4_ = auVar105._16_4_ * fVar245;
  auVar107._20_4_ = auVar105._20_4_ * fVar220;
  auVar107._24_4_ = auVar105._24_4_ * fVar221;
  auVar107._28_4_ = auVar97._28_4_;
  auVar93 = vfmadd231ps_fma(auVar108,auVar106,auVar98);
  auVar85 = vfmadd231ps_fma(auVar95,auVar106,auVar103);
  auVar89 = vfmadd231ps_fma(auVar107,auVar106,auVar104);
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar119,auVar99);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar119,auVar102);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar119,auVar100);
  auVar114._8_4_ = 0x7fffffff;
  auVar114._0_8_ = 0x7fffffff7fffffff;
  auVar114._12_4_ = 0x7fffffff;
  auVar114._16_4_ = 0x7fffffff;
  auVar114._20_4_ = 0x7fffffff;
  auVar114._24_4_ = 0x7fffffff;
  auVar114._28_4_ = 0x7fffffff;
  auVar99 = vandps_avx(ZEXT1632(auVar87),auVar114);
  auVar115._8_4_ = 0x219392ef;
  auVar115._0_8_ = 0x219392ef219392ef;
  auVar115._12_4_ = 0x219392ef;
  auVar115._16_4_ = 0x219392ef;
  auVar115._20_4_ = 0x219392ef;
  auVar115._24_4_ = 0x219392ef;
  auVar115._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar99,auVar115,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar96._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar87._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar88),auVar114);
  uVar76 = vcmpps_avx512vl(auVar99,auVar115,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar110._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar88._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar99 = vandps_avx(ZEXT1632(auVar92),auVar114);
  uVar76 = vcmpps_avx512vl(auVar99,auVar115,1);
  bVar82 = (bool)((byte)uVar76 & 1);
  auVar99._0_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._0_4_;
  bVar82 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._4_4_;
  bVar82 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._8_4_;
  bVar82 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar82 * 0x219392ef | (uint)!bVar82 * auVar92._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar98 = vrcp14ps_avx512vl(auVar96);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar252 = ZEXT3264(auVar117);
  auVar87 = vfnmadd213ps_fma(auVar96,auVar98,auVar117);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar110);
  auVar88 = vfnmadd213ps_fma(auVar110,auVar98,auVar117);
  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar98,auVar98);
  auVar98 = vrcp14ps_avx512vl(auVar99);
  auVar92 = vfnmadd213ps_fma(auVar99,auVar98,auVar117);
  auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar98,auVar98);
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 7 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar93));
  auVar100._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar100._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar100._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar100._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar100._16_4_ = auVar99._16_4_ * 0.0;
  auVar100._20_4_ = auVar99._20_4_ * 0.0;
  auVar100._24_4_ = auVar99._24_4_ * 0.0;
  auVar100._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 9 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar93));
  auVar113._0_4_ = auVar87._0_4_ * auVar99._0_4_;
  auVar113._4_4_ = auVar87._4_4_ * auVar99._4_4_;
  auVar113._8_4_ = auVar87._8_4_ * auVar99._8_4_;
  auVar113._12_4_ = auVar87._12_4_ * auVar99._12_4_;
  auVar113._16_4_ = auVar99._16_4_ * 0.0;
  auVar113._20_4_ = auVar99._20_4_ * 0.0;
  auVar113._24_4_ = auVar99._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0xe + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar85));
  auVar104._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar104._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar104._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar104._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar104._16_4_ = auVar99._16_4_ * 0.0;
  auVar104._20_4_ = auVar99._20_4_ * 0.0;
  auVar104._24_4_ = auVar99._24_4_ * 0.0;
  auVar104._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar85));
  auVar112._0_4_ = auVar88._0_4_ * auVar99._0_4_;
  auVar112._4_4_ = auVar88._4_4_ * auVar99._4_4_;
  auVar112._8_4_ = auVar88._8_4_ * auVar99._8_4_;
  auVar112._12_4_ = auVar88._12_4_ * auVar99._12_4_;
  auVar112._16_4_ = auVar99._16_4_ * 0.0;
  auVar112._20_4_ = auVar99._20_4_ * 0.0;
  auVar112._24_4_ = auVar99._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x15 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar89));
  auVar105._4_4_ = auVar99._4_4_ * auVar92._4_4_;
  auVar105._0_4_ = auVar99._0_4_ * auVar92._0_4_;
  auVar105._8_4_ = auVar99._8_4_ * auVar92._8_4_;
  auVar105._12_4_ = auVar99._12_4_ * auVar92._12_4_;
  auVar105._16_4_ = auVar99._16_4_ * 0.0;
  auVar105._20_4_ = auVar99._20_4_ * 0.0;
  auVar105._24_4_ = auVar99._24_4_ * 0.0;
  auVar105._28_4_ = auVar99._28_4_;
  auVar99 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 * 0x17 + 6));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar99 = vsubps_avx(auVar99,ZEXT1632(auVar89));
  auVar111._0_4_ = auVar92._0_4_ * auVar99._0_4_;
  auVar111._4_4_ = auVar92._4_4_ * auVar99._4_4_;
  auVar111._8_4_ = auVar92._8_4_ * auVar99._8_4_;
  auVar111._12_4_ = auVar92._12_4_ * auVar99._12_4_;
  auVar111._16_4_ = auVar99._16_4_ * 0.0;
  auVar111._20_4_ = auVar99._20_4_ * 0.0;
  auVar111._24_4_ = auVar99._24_4_ * 0.0;
  auVar111._28_4_ = 0;
  auVar99 = vpminsd_avx2(auVar100,auVar113);
  auVar98 = vpminsd_avx2(auVar104,auVar112);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98 = vpminsd_avx2(auVar105,auVar111);
  uVar144 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar101._4_4_ = uVar144;
  auVar101._0_4_ = uVar144;
  auVar101._8_4_ = uVar144;
  auVar101._12_4_ = uVar144;
  auVar101._16_4_ = uVar144;
  auVar101._20_4_ = uVar144;
  auVar101._24_4_ = uVar144;
  auVar101._28_4_ = uVar144;
  auVar98 = vmaxps_avx512vl(auVar98,auVar101);
  auVar99 = vmaxps_avx(auVar99,auVar98);
  auVar98._8_4_ = 0x3f7ffffa;
  auVar98._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar98._12_4_ = 0x3f7ffffa;
  auVar98._16_4_ = 0x3f7ffffa;
  auVar98._20_4_ = 0x3f7ffffa;
  auVar98._24_4_ = 0x3f7ffffa;
  auVar98._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar99,auVar98);
  auVar99 = vpmaxsd_avx2(auVar100,auVar113);
  auVar98 = vpmaxsd_avx2(auVar104,auVar112);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar98 = vpmaxsd_avx2(auVar105,auVar111);
  fVar202 = ray->tfar;
  auVar102._4_4_ = fVar202;
  auVar102._0_4_ = fVar202;
  auVar102._8_4_ = fVar202;
  auVar102._12_4_ = fVar202;
  auVar102._16_4_ = fVar202;
  auVar102._20_4_ = fVar202;
  auVar102._24_4_ = fVar202;
  auVar102._28_4_ = fVar202;
  auVar98 = vminps_avx512vl(auVar98,auVar102);
  auVar99 = vminps_avx(auVar99,auVar98);
  auVar103._8_4_ = 0x3f800003;
  auVar103._0_8_ = 0x3f8000033f800003;
  auVar103._12_4_ = 0x3f800003;
  auVar103._16_4_ = 0x3f800003;
  auVar103._20_4_ = 0x3f800003;
  auVar103._24_4_ = 0x3f800003;
  auVar103._28_4_ = 0x3f800003;
  auVar99 = vmulps_avx512vl(auVar99,auVar103);
  auVar98 = vpbroadcastd_avx512vl();
  uVar15 = vcmpps_avx512vl(local_280,auVar99,2);
  uVar17 = vpcmpgtd_avx512vl(auVar98,_DAT_01fb4ba0);
  local_5e8 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar15 & (byte)uVar17));
  local_938 = context;
  local_600 = pPVar81;
  local_5f8 = prim;
LAB_019d075f:
  if (local_5e8 == 0) {
LAB_019d2f9f:
    return local_5e8 != 0;
  }
  lVar19 = 0;
  for (uVar76 = local_5e8; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar19 = lVar19 + 1;
  }
  local_5f0 = local_5e8 - 1 & local_5e8;
  local_92c = *(undefined4 *)(prim + lVar19 * 4 + 6);
  uVar76 = (ulong)(uint)((int)lVar19 << 6);
  auVar87 = *(undefined1 (*) [16])(pPVar81 + uVar76);
  if (local_5f0 != 0) {
    uVar77 = local_5f0 - 1 & local_5f0;
    for (uVar83 = local_5f0; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar88 = *(undefined1 (*) [16])(pPVar81 + uVar76 + 0x10);
  auVar92 = *(undefined1 (*) [16])(pPVar81 + uVar76 + 0x20);
  auVar93 = *(undefined1 (*) [16])(pPVar81 + uVar76 + 0x30);
  auVar226._0_4_ = auVar87._0_4_ + auVar88._0_4_ + auVar92._0_4_ + auVar93._0_4_;
  auVar226._4_4_ = auVar87._4_4_ + auVar88._4_4_ + auVar92._4_4_ + auVar93._4_4_;
  auVar226._8_4_ = auVar87._8_4_ + auVar88._8_4_ + auVar92._8_4_ + auVar93._8_4_;
  auVar226._12_4_ = auVar87._12_4_ + auVar88._12_4_ + auVar92._12_4_ + auVar93._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar85 = vmulps_avx512vl(auVar226,auVar91);
  auVar85 = vsubps_avx(auVar85,(undefined1  [16])aVar1);
  auVar85 = vdpps_avx(auVar85,(undefined1  [16])aVar2,0x7f);
  auVar89 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  local_928 = (ulong)*(uint *)(prim + 2);
  auVar94 = ZEXT816(0) << 0x40;
  auVar249 = ZEXT1664(auVar94);
  auVar239._4_12_ = ZEXT812(0) << 0x20;
  auVar239._0_4_ = auVar89._0_4_;
  auVar86 = vrcp14ss_avx512f(auVar94,auVar239);
  auVar89 = vfnmadd213ss_fma(auVar86,auVar89,ZEXT416(0x40000000));
  fVar202 = auVar85._0_4_ * auVar86._0_4_ * auVar89._0_4_;
  local_4e0 = ZEXT416((uint)fVar202);
  auVar227._4_4_ = fVar202;
  auVar227._0_4_ = fVar202;
  auVar227._8_4_ = fVar202;
  auVar227._12_4_ = fVar202;
  fStack_3d0 = fVar202;
  _local_3e0 = auVar227;
  fStack_3cc = fVar202;
  fStack_3c8 = fVar202;
  fStack_3c4 = fVar202;
  auVar85 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar227);
  auVar85 = vblendps_avx(auVar85,auVar94,8);
  auVar231 = ZEXT1664(auVar85);
  auVar87 = vsubps_avx(auVar87,auVar85);
  uVar144 = *(undefined4 *)&(ray->dir).field_0;
  local_3a0._4_4_ = uVar144;
  local_3a0._0_4_ = uVar144;
  local_3a0._8_4_ = uVar144;
  local_3a0._12_4_ = uVar144;
  local_3a0._16_4_ = uVar144;
  local_3a0._20_4_ = uVar144;
  local_3a0._24_4_ = uVar144;
  local_3a0._28_4_ = uVar144;
  auVar246 = ZEXT3264(local_3a0);
  auVar92 = vsubps_avx(auVar92,auVar85);
  auVar238 = ZEXT1664(auVar92);
  local_720 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
  auVar265 = ZEXT3264(local_720);
  local_420 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  auVar88 = vsubps_avx(auVar88,auVar85);
  auVar242 = ZEXT1664(auVar88);
  auVar93 = vsubps_avx(auVar93,auVar85);
  local_7e0 = vbroadcastss_avx512vl(auVar87);
  auVar263 = ZEXT3264(local_7e0);
  auVar122._8_4_ = 1;
  auVar122._0_8_ = 0x100000001;
  auVar122._12_4_ = 1;
  auVar122._16_4_ = 1;
  auVar122._20_4_ = 1;
  auVar122._24_4_ = 1;
  auVar122._28_4_ = 1;
  local_560 = ZEXT1632(auVar87);
  local_800 = vpermps_avx512vl(auVar122,local_560);
  auVar257 = ZEXT3264(local_800);
  auVar125._8_4_ = 2;
  auVar125._0_8_ = 0x200000002;
  auVar125._12_4_ = 2;
  auVar125._16_4_ = 2;
  auVar125._20_4_ = 2;
  auVar125._24_4_ = 2;
  auVar125._28_4_ = 2;
  local_820 = vpermps_avx512vl(auVar125,local_560);
  auVar258 = ZEXT3264(local_820);
  auVar217._8_4_ = 3;
  auVar217._0_8_ = 0x300000003;
  auVar217._12_4_ = 3;
  auVar217._16_4_ = 3;
  auVar217._20_4_ = 3;
  auVar217._24_4_ = 3;
  auVar217._28_4_ = 3;
  local_840 = vpermps_avx512vl(auVar217,local_560);
  auVar259 = ZEXT3264(local_840);
  local_860 = vbroadcastss_avx512vl(auVar88);
  auVar260 = ZEXT3264(local_860);
  local_5a0 = ZEXT1632(auVar88);
  local_880 = vpermps_avx512vl(auVar122,local_5a0);
  auVar261 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar125,local_5a0);
  auVar262 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar217,local_5a0);
  auVar264 = ZEXT3264(local_8c0);
  local_8e0 = vbroadcastss_avx512vl(auVar92);
  auVar266 = ZEXT3264(local_8e0);
  local_580 = ZEXT1632(auVar92);
  local_740 = vpermps_avx512vl(auVar122,local_580);
  auVar267 = ZEXT3264(local_740);
  local_760 = vpermps_avx512vl(auVar125,local_580);
  auVar268 = ZEXT3264(local_760);
  local_7c0 = vpermps_avx512vl(auVar217,local_580);
  auVar269 = ZEXT3264(local_7c0);
  local_900 = vbroadcastss_avx512vl(auVar93);
  auVar270 = ZEXT3264(local_900);
  _local_5c0 = ZEXT1632(auVar93);
  _local_1e0 = vpermps_avx2(auVar122,_local_5c0);
  local_240 = vpermps_avx512vl(auVar125,_local_5c0);
  local_260 = vpermps_avx2(auVar217,_local_5c0);
  auVar99 = vpermps_avx2(auVar125,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  local_220 = vfmadd231ps_avx512vl(auVar99,local_720,local_720);
  auVar87 = vfmadd231ps_fma(local_220,local_3a0,local_3a0);
  local_200 = ZEXT1632(auVar87);
  auVar121._8_4_ = 0x7fffffff;
  auVar121._0_8_ = 0x7fffffff7fffffff;
  auVar121._12_4_ = 0x7fffffff;
  auVar121._16_4_ = 0x7fffffff;
  auVar121._20_4_ = 0x7fffffff;
  auVar121._24_4_ = 0x7fffffff;
  auVar121._28_4_ = 0x7fffffff;
  vandps_avx512vl(ZEXT1632(auVar87),auVar121);
  uVar76 = 0;
  bVar78 = 0;
  local_94c = 1;
  local_350 = ZEXT816(0x3f80000000000000);
  uStack_41c = local_420;
  uStack_418 = local_420;
  uStack_414 = local_420;
  uStack_410 = local_420;
  uStack_40c = local_420;
  uStack_408 = local_420;
  uStack_404 = local_420;
  do {
    auVar87 = vmovshdup_avx(local_350);
    auVar87 = vsubps_avx(auVar87,local_350);
    auVar145._0_4_ = auVar87._0_4_;
    fVar14 = auVar145._0_4_ * 0.04761905;
    uVar144 = local_350._0_4_;
    local_7a0._4_4_ = uVar144;
    local_7a0._0_4_ = uVar144;
    local_7a0._8_4_ = uVar144;
    local_7a0._12_4_ = uVar144;
    local_7a0._16_4_ = uVar144;
    local_7a0._20_4_ = uVar144;
    local_7a0._24_4_ = uVar144;
    local_7a0._28_4_ = uVar144;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    local_700._16_4_ = auVar145._0_4_;
    local_700._0_16_ = auVar145;
    local_700._20_4_ = auVar145._0_4_;
    local_700._24_4_ = auVar145._0_4_;
    local_700._28_4_ = auVar145._0_4_;
    auVar87 = vfmadd231ps_fma(local_7a0,local_700,_DAT_01f7b040);
    auVar99 = vsubps_avx(auVar252._0_32_,ZEXT1632(auVar87));
    fVar142 = auVar99._0_4_;
    fVar244 = auVar99._4_4_;
    fVar220 = auVar99._8_4_;
    fVar164 = auVar99._12_4_;
    fVar181 = auVar99._16_4_;
    fVar12 = auVar99._20_4_;
    fVar13 = auVar99._24_4_;
    fVar143 = fVar142 * fVar142 * fVar142;
    fVar159 = fVar244 * fVar244 * fVar244;
    auVar38._4_4_ = fVar159;
    auVar38._0_4_ = fVar143;
    fVar160 = fVar220 * fVar220 * fVar220;
    auVar38._8_4_ = fVar160;
    fVar161 = fVar164 * fVar164 * fVar164;
    auVar38._12_4_ = fVar161;
    fVar162 = fVar181 * fVar181 * fVar181;
    auVar38._16_4_ = fVar162;
    fVar163 = fVar12 * fVar12 * fVar12;
    auVar38._20_4_ = fVar163;
    fVar165 = fVar13 * fVar13 * fVar13;
    auVar38._24_4_ = fVar165;
    auVar38._28_4_ = auVar145._0_4_;
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar98 = vmulps_avx512vl(auVar38,auVar100);
    fVar243 = auVar87._0_4_;
    fVar245 = auVar87._4_4_;
    fVar221 = auVar87._8_4_;
    fVar179 = auVar87._12_4_;
    fVar180 = fVar243 * fVar243 * fVar243;
    fVar199 = fVar245 * fVar245 * fVar245;
    fVar200 = fVar221 * fVar221 * fVar221;
    fVar201 = fVar179 * fVar179 * fVar179;
    auVar247._0_4_ = fVar243 * fVar142;
    auVar247._4_4_ = fVar245 * fVar244;
    auVar247._8_4_ = fVar221 * fVar220;
    auVar247._12_4_ = fVar179 * fVar164;
    auVar247._16_4_ = fVar181 * 0.0;
    auVar247._20_4_ = fVar12 * 0.0;
    auVar247._28_36_ = auVar246._28_36_;
    auVar247._24_4_ = fVar13 * 0.0;
    fVar202 = auVar254._28_4_;
    auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar180)
                                                                  ))),auVar100);
    fVar250 = auVar101._28_4_ + auVar145._0_4_;
    fVar232 = fVar250 + auVar252._28_4_ + auVar231._28_4_;
    auVar39._4_4_ = fVar159 * 0.16666667;
    auVar39._0_4_ = fVar143 * 0.16666667;
    auVar39._8_4_ = fVar160 * 0.16666667;
    auVar39._12_4_ = fVar161 * 0.16666667;
    auVar39._16_4_ = fVar162 * 0.16666667;
    auVar39._20_4_ = fVar163 * 0.16666667;
    auVar39._24_4_ = fVar165 * 0.16666667;
    auVar39._28_4_ = fVar250;
    auVar40._4_4_ =
         (auVar247._4_4_ * fVar244 * 12.0 + auVar247._4_4_ * fVar245 * 6.0 + fVar199 + auVar98._4_4_
         ) * 0.16666667;
    auVar40._0_4_ =
         (auVar247._0_4_ * fVar142 * 12.0 + auVar247._0_4_ * fVar243 * 6.0 + fVar180 + auVar98._0_4_
         ) * 0.16666667;
    auVar40._8_4_ =
         (auVar247._8_4_ * fVar220 * 12.0 + auVar247._8_4_ * fVar221 * 6.0 + fVar200 + auVar98._8_4_
         ) * 0.16666667;
    auVar40._12_4_ =
         (auVar247._12_4_ * fVar164 * 12.0 + auVar247._12_4_ * fVar179 * 6.0 +
         fVar201 + auVar98._12_4_) * 0.16666667;
    auVar40._16_4_ =
         (auVar247._16_4_ * fVar181 * 12.0 + auVar247._16_4_ * 0.0 * 6.0 + auVar98._16_4_ + 0.0) *
         0.16666667;
    auVar40._20_4_ =
         (auVar247._20_4_ * fVar12 * 12.0 + auVar247._20_4_ * 0.0 * 6.0 + auVar98._20_4_ + 0.0) *
         0.16666667;
    auVar40._24_4_ =
         (auVar247._24_4_ * fVar13 * 12.0 + auVar247._24_4_ * 0.0 * 6.0 + auVar98._24_4_ + 0.0) *
         0.16666667;
    auVar40._28_4_ = auVar252._28_4_;
    auVar41._4_4_ =
         (auVar101._4_4_ + fVar159 +
         auVar247._4_4_ * fVar245 * 12.0 + auVar247._4_4_ * fVar244 * 6.0) * 0.16666667;
    auVar41._0_4_ =
         (auVar101._0_4_ + fVar143 +
         auVar247._0_4_ * fVar243 * 12.0 + auVar247._0_4_ * fVar142 * 6.0) * 0.16666667;
    auVar41._8_4_ =
         (auVar101._8_4_ + fVar160 +
         auVar247._8_4_ * fVar221 * 12.0 + auVar247._8_4_ * fVar220 * 6.0) * 0.16666667;
    auVar41._12_4_ =
         (auVar101._12_4_ + fVar161 +
         auVar247._12_4_ * fVar179 * 12.0 + auVar247._12_4_ * fVar164 * 6.0) * 0.16666667;
    auVar41._16_4_ =
         (auVar101._16_4_ + fVar162 + auVar247._16_4_ * 0.0 * 12.0 + auVar247._16_4_ * fVar181 * 6.0
         ) * 0.16666667;
    auVar41._20_4_ =
         (auVar101._20_4_ + fVar163 + auVar247._20_4_ * 0.0 * 12.0 + auVar247._20_4_ * fVar12 * 6.0)
         * 0.16666667;
    auVar41._24_4_ =
         (auVar101._24_4_ + fVar165 + auVar247._24_4_ * 0.0 * 12.0 + auVar247._24_4_ * fVar13 * 6.0)
         * 0.16666667;
    auVar41._28_4_ = fVar202;
    fVar180 = fVar180 * 0.16666667;
    fVar199 = fVar199 * 0.16666667;
    fVar200 = fVar200 * 0.16666667;
    fVar201 = fVar201 * 0.16666667;
    auVar42._28_4_ = fVar232;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar201,CONCAT48(fVar200,CONCAT44(fVar199,fVar180))));
    auVar101 = vmulps_avx512vl(auVar270._0_32_,auVar42);
    auVar43._4_4_ = (float)local_1e0._4_4_ * fVar199;
    auVar43._0_4_ = (float)local_1e0._0_4_ * fVar180;
    auVar43._8_4_ = fStack_1d8 * fVar200;
    auVar43._12_4_ = fStack_1d4 * fVar201;
    auVar43._16_4_ = fStack_1d0 * 0.0;
    auVar43._20_4_ = fStack_1cc * 0.0;
    auVar43._24_4_ = fStack_1c8 * 0.0;
    auVar43._28_4_ = auVar249._28_4_ + fVar202 + auVar98._28_4_ + 0.0;
    auVar98 = vmulps_avx512vl(local_240,auVar42);
    auVar44._4_4_ = local_260._4_4_ * fVar199;
    auVar44._0_4_ = local_260._0_4_ * fVar180;
    auVar44._8_4_ = local_260._8_4_ * fVar200;
    auVar44._12_4_ = local_260._12_4_ * fVar201;
    auVar44._16_4_ = local_260._16_4_ * 0.0;
    auVar44._20_4_ = local_260._20_4_ * 0.0;
    auVar44._24_4_ = local_260._24_4_ * 0.0;
    auVar44._28_4_ = fVar232;
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar41,auVar266._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar43,auVar41,auVar267._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar41,auVar268._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar44,auVar269._0_32_,auVar41);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar40,auVar260._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar40,auVar261._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar40,auVar262._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar264._0_32_,auVar40);
    auVar104 = vfmadd231ps_avx512vl(auVar101,auVar39,auVar263._0_32_);
    auVar105 = vfmadd231ps_avx512vl(auVar102,auVar39,auVar257._0_32_);
    auVar106 = vfmadd231ps_avx512vl(auVar98,auVar39,auVar258._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar103,auVar259._0_32_,auVar39);
    auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar102 = vxorps_avx512vl(auVar99,auVar98);
    auVar103 = vxorps_avx512vl(ZEXT1632(auVar87),auVar98);
    auVar224._0_4_ = auVar103._0_4_ * fVar243;
    auVar224._4_4_ = auVar103._4_4_ * fVar245;
    auVar224._8_4_ = auVar103._8_4_ * fVar221;
    auVar224._12_4_ = auVar103._12_4_ * fVar179;
    auVar224._16_4_ = auVar103._16_4_ * 0.0;
    auVar224._20_4_ = auVar103._20_4_ * 0.0;
    auVar224._24_4_ = auVar103._24_4_ * 0.0;
    auVar224._28_4_ = 0;
    auVar107 = vmulps_avx512vl(auVar247._0_32_,auVar100);
    auVar98 = vsubps_avx(auVar224,auVar107);
    auVar45._4_4_ = auVar102._4_4_ * fVar244 * 0.5;
    auVar45._0_4_ = auVar102._0_4_ * fVar142 * 0.5;
    auVar45._8_4_ = auVar102._8_4_ * fVar220 * 0.5;
    auVar45._12_4_ = auVar102._12_4_ * fVar164 * 0.5;
    auVar45._16_4_ = auVar102._16_4_ * fVar181 * 0.5;
    auVar45._20_4_ = auVar102._20_4_ * fVar12 * 0.5;
    auVar45._24_4_ = auVar102._24_4_ * fVar13 * 0.5;
    auVar45._28_4_ = auVar99._28_4_;
    auVar46._4_4_ = auVar98._4_4_ * 0.5;
    auVar46._0_4_ = auVar98._0_4_ * 0.5;
    auVar46._8_4_ = auVar98._8_4_ * 0.5;
    auVar46._12_4_ = auVar98._12_4_ * 0.5;
    auVar46._16_4_ = auVar98._16_4_ * 0.5;
    auVar46._20_4_ = auVar98._20_4_ * 0.5;
    auVar46._24_4_ = auVar98._24_4_ * 0.5;
    auVar46._28_4_ = auVar98._28_4_;
    auVar47._4_4_ = (auVar107._4_4_ + fVar244 * fVar244) * 0.5;
    auVar47._0_4_ = (auVar107._0_4_ + fVar142 * fVar142) * 0.5;
    auVar47._8_4_ = (auVar107._8_4_ + fVar220 * fVar220) * 0.5;
    auVar47._12_4_ = (auVar107._12_4_ + fVar164 * fVar164) * 0.5;
    auVar47._16_4_ = (auVar107._16_4_ + fVar181 * fVar181) * 0.5;
    auVar47._20_4_ = (auVar107._20_4_ + fVar12 * fVar12) * 0.5;
    auVar47._24_4_ = (auVar107._24_4_ + fVar13 * fVar13) * 0.5;
    auVar47._28_4_ = auVar107._28_4_ + auVar238._28_4_;
    fVar142 = fVar243 * fVar243 * 0.5;
    fVar243 = fVar245 * fVar245 * 0.5;
    fVar244 = fVar221 * fVar221 * 0.5;
    fVar245 = fVar179 * fVar179 * 0.5;
    auVar48._28_4_ = auVar242._28_4_;
    auVar48._0_28_ = ZEXT1628(CONCAT412(fVar245,CONCAT48(fVar244,CONCAT44(fVar243,fVar142))));
    auVar49._4_4_ = auVar270._4_4_ * fVar243;
    auVar49._0_4_ = auVar270._0_4_ * fVar142;
    auVar49._8_4_ = auVar270._8_4_ * fVar244;
    auVar49._12_4_ = auVar270._12_4_ * fVar245;
    auVar49._16_4_ = auVar270._16_4_ * 0.0;
    auVar49._20_4_ = auVar270._20_4_ * 0.0;
    auVar49._24_4_ = auVar270._24_4_ * 0.0;
    auVar49._28_4_ = 0x3f000000;
    auVar50._4_4_ = (float)local_1e0._4_4_ * fVar243;
    auVar50._0_4_ = (float)local_1e0._0_4_ * fVar142;
    auVar50._8_4_ = fStack_1d8 * fVar244;
    auVar50._12_4_ = fStack_1d4 * fVar245;
    auVar50._16_4_ = fStack_1d0 * 0.0;
    auVar50._20_4_ = fStack_1cc * 0.0;
    auVar50._24_4_ = fStack_1c8 * 0.0;
    auVar50._28_4_ = auVar103._28_4_;
    auVar99 = vmulps_avx512vl(local_240,auVar48);
    auVar51._4_4_ = fVar243 * local_260._4_4_;
    auVar51._0_4_ = fVar142 * local_260._0_4_;
    auVar51._8_4_ = fVar244 * local_260._8_4_;
    auVar51._12_4_ = fVar245 * local_260._12_4_;
    auVar51._16_4_ = local_260._16_4_ * 0.0;
    auVar51._20_4_ = local_260._20_4_ * 0.0;
    auVar51._24_4_ = local_260._24_4_ * 0.0;
    auVar51._28_4_ = auVar242._28_4_;
    auVar98 = vfmadd231ps_avx512vl(auVar49,auVar47,auVar266._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar267._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar47,auVar268._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar51,auVar269._0_32_,auVar47);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar46,auVar260._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar46,auVar261._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar46,auVar262._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar264._0_32_,auVar46);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar45,auVar263._0_32_);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar45,auVar257._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar45,auVar258._0_32_);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar259._0_32_,auVar45);
    auVar218._4_4_ = fVar14;
    auVar218._0_4_ = fVar14;
    auVar218._8_4_ = fVar14;
    auVar218._12_4_ = fVar14;
    auVar218._16_4_ = fVar14;
    auVar218._20_4_ = fVar14;
    auVar218._24_4_ = fVar14;
    auVar218._28_4_ = fVar14;
    auVar97 = vmulps_avx512vl(auVar218,auVar98);
    auVar52._4_4_ = auVar102._4_4_ * fVar14;
    auVar52._0_4_ = auVar102._0_4_ * fVar14;
    auVar52._8_4_ = auVar102._8_4_ * fVar14;
    auVar52._12_4_ = auVar102._12_4_ * fVar14;
    auVar52._16_4_ = auVar102._16_4_ * fVar14;
    auVar52._20_4_ = auVar102._20_4_ * fVar14;
    auVar52._24_4_ = auVar102._24_4_ * fVar14;
    auVar52._28_4_ = fVar202;
    auVar254 = ZEXT3264(auVar52);
    auVar53._4_4_ = auVar99._4_4_ * fVar14;
    auVar53._0_4_ = auVar99._0_4_ * fVar14;
    auVar53._8_4_ = auVar99._8_4_ * fVar14;
    auVar53._12_4_ = auVar99._12_4_ * fVar14;
    auVar53._16_4_ = auVar99._16_4_ * fVar14;
    auVar53._20_4_ = auVar99._20_4_ * fVar14;
    auVar53._24_4_ = auVar99._24_4_ * fVar14;
    auVar53._28_4_ = auVar99._28_4_;
    fVar202 = auVar103._0_4_ * fVar14;
    fVar142 = auVar103._4_4_ * fVar14;
    auVar54._4_4_ = fVar142;
    auVar54._0_4_ = fVar202;
    fVar243 = auVar103._8_4_ * fVar14;
    auVar54._8_4_ = fVar243;
    fVar244 = auVar103._12_4_ * fVar14;
    auVar54._12_4_ = fVar244;
    fVar245 = auVar103._16_4_ * fVar14;
    auVar54._16_4_ = fVar245;
    fVar220 = auVar103._20_4_ * fVar14;
    auVar54._20_4_ = fVar220;
    fVar221 = auVar103._24_4_ * fVar14;
    auVar54._24_4_ = fVar221;
    auVar54._28_4_ = fVar14;
    auVar87 = vxorps_avx512vl(auVar269._0_16_,auVar269._0_16_);
    auVar108 = vpermt2ps_avx512vl(auVar104,_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar242 = ZEXT3264(auVar108);
    auVar109 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar246 = ZEXT3264(auVar109);
    auVar102 = ZEXT1632(auVar87);
    auVar95 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar102);
    auVar249 = ZEXT3264(auVar95);
    auVar225._0_4_ = fVar202 + auVar101._0_4_;
    auVar225._4_4_ = fVar142 + auVar101._4_4_;
    auVar225._8_4_ = fVar243 + auVar101._8_4_;
    auVar225._12_4_ = fVar244 + auVar101._12_4_;
    auVar225._16_4_ = fVar245 + auVar101._16_4_;
    auVar225._20_4_ = fVar220 + auVar101._20_4_;
    auVar225._24_4_ = fVar221 + auVar101._24_4_;
    auVar225._28_4_ = fVar14 + auVar101._28_4_;
    auVar99 = vmaxps_avx(auVar101,auVar225);
    auVar98 = vminps_avx(auVar101,auVar225);
    auVar96 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar102);
    auVar110 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,auVar102);
    auVar111 = vpermt2ps_avx512vl(auVar52,_DAT_01fb9fc0,auVar102);
    auVar122 = ZEXT1632(auVar87);
    auVar112 = vpermt2ps_avx512vl(auVar53,_DAT_01fb9fc0,auVar122);
    auVar101 = vpermt2ps_avx512vl(auVar54,_DAT_01fb9fc0,auVar122);
    auVar101 = vsubps_avx(auVar96,auVar101);
    auVar102 = vsubps_avx(auVar108,auVar104);
    auVar238 = ZEXT3264(auVar102);
    auVar103 = vsubps_avx(auVar109,auVar105);
    auVar107 = vsubps_avx(auVar95,auVar106);
    auVar231 = ZEXT3264(auVar107);
    auVar113 = vmulps_avx512vl(auVar103,auVar53);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar52,auVar107);
    auVar114 = vmulps_avx512vl(auVar107,auVar97);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar53,auVar102);
    auVar115 = vmulps_avx512vl(auVar102,auVar52);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar97,auVar103);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar114 = vmulps_avx512vl(auVar107,auVar107);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar103,auVar103);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar102,auVar102);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar117 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar116);
    auVar115 = vfmadd132ps_avx512vl(auVar117,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar115);
    auVar117 = vmulps_avx512vl(auVar103,auVar112);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar111,auVar107);
    auVar118 = vmulps_avx512vl(auVar107,auVar110);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar112,auVar102);
    auVar119 = vmulps_avx512vl(auVar102,auVar111);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar110,auVar103);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar115 = vmulps_avx512vl(auVar117,auVar115);
    auVar113 = vmaxps_avx512vl(auVar113,auVar115);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar115 = vmaxps_avx512vl(auVar101,auVar96);
    auVar99 = vmaxps_avx512vl(auVar99,auVar115);
    auVar115 = vaddps_avx512vl(auVar113,auVar99);
    auVar99 = vminps_avx(auVar101,auVar96);
    auVar99 = vminps_avx(auVar98,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar113);
    auVar26._8_4_ = 0x3f800002;
    auVar26._0_8_ = 0x3f8000023f800002;
    auVar26._12_4_ = 0x3f800002;
    auVar26._16_4_ = 0x3f800002;
    auVar26._20_4_ = 0x3f800002;
    auVar26._24_4_ = 0x3f800002;
    auVar26._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar115,auVar26);
    auVar27._8_4_ = 0x3f7ffffc;
    auVar27._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar27._12_4_ = 0x3f7ffffc;
    auVar27._16_4_ = 0x3f7ffffc;
    auVar27._20_4_ = 0x3f7ffffc;
    auVar27._24_4_ = 0x3f7ffffc;
    auVar27._28_4_ = 0x3f7ffffc;
    local_920 = vmulps_avx512vl(auVar99,auVar27);
    auVar99 = vmulps_avx512vl(auVar98,auVar98);
    auVar98 = vrsqrt14ps_avx512vl(auVar114);
    auVar28._8_4_ = 0xbf000000;
    auVar28._0_8_ = 0xbf000000bf000000;
    auVar28._12_4_ = 0xbf000000;
    auVar28._16_4_ = 0xbf000000;
    auVar28._20_4_ = 0xbf000000;
    auVar28._24_4_ = 0xbf000000;
    auVar28._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar114,auVar28);
    fVar202 = auVar98._0_4_;
    fVar142 = auVar98._4_4_;
    fVar243 = auVar98._8_4_;
    fVar244 = auVar98._12_4_;
    fVar245 = auVar98._16_4_;
    fVar220 = auVar98._20_4_;
    fVar221 = auVar98._24_4_;
    auVar55._4_4_ = fVar142 * fVar142 * fVar142 * auVar101._4_4_;
    auVar55._0_4_ = fVar202 * fVar202 * fVar202 * auVar101._0_4_;
    auVar55._8_4_ = fVar243 * fVar243 * fVar243 * auVar101._8_4_;
    auVar55._12_4_ = fVar244 * fVar244 * fVar244 * auVar101._12_4_;
    auVar55._16_4_ = fVar245 * fVar245 * fVar245 * auVar101._16_4_;
    auVar55._20_4_ = fVar220 * fVar220 * fVar220 * auVar101._20_4_;
    auVar55._24_4_ = fVar221 * fVar221 * fVar221 * auVar101._24_4_;
    auVar55._28_4_ = auVar115._28_4_;
    auVar29._8_4_ = 0x3fc00000;
    auVar29._0_8_ = 0x3fc000003fc00000;
    auVar29._12_4_ = 0x3fc00000;
    auVar29._16_4_ = 0x3fc00000;
    auVar29._20_4_ = 0x3fc00000;
    auVar29._24_4_ = 0x3fc00000;
    auVar29._28_4_ = 0x3fc00000;
    auVar98 = vfmadd231ps_avx512vl(auVar55,auVar98,auVar29);
    auVar101 = vmulps_avx512vl(auVar102,auVar98);
    auVar96 = vmulps_avx512vl(auVar103,auVar98);
    auVar113 = vmulps_avx512vl(auVar107,auVar98);
    auVar114 = vsubps_avx512vl(auVar122,auVar104);
    auVar115 = vsubps_avx512vl(auVar122,auVar105);
    auVar117 = vsubps_avx512vl(auVar122,auVar106);
    auVar69._4_4_ = uStack_41c;
    auVar69._0_4_ = local_420;
    auVar69._8_4_ = uStack_418;
    auVar69._12_4_ = uStack_414;
    auVar69._16_4_ = uStack_410;
    auVar69._20_4_ = uStack_40c;
    auVar69._24_4_ = uStack_408;
    auVar69._28_4_ = uStack_404;
    auVar118 = vmulps_avx512vl(auVar69,auVar117);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar265._0_32_,auVar115);
    auVar118 = vfmadd231ps_avx512vl(auVar118,local_3a0,auVar114);
    auVar119 = vmulps_avx512vl(auVar117,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar115,auVar115);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar114,auVar114);
    auVar120 = vmulps_avx512vl(auVar69,auVar113);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar96,auVar265._0_32_);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar101,local_3a0);
    auVar113 = vmulps_avx512vl(auVar117,auVar113);
    auVar96 = vfmadd231ps_avx512vl(auVar113,auVar115,auVar96);
    auVar101 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar101);
    auVar96 = vmulps_avx512vl(auVar120,auVar120);
    auVar113 = vsubps_avx512vl(local_200,auVar96);
    auVar121 = vmulps_avx512vl(auVar120,auVar101);
    auVar118 = vsubps_avx512vl(auVar118,auVar121);
    auVar118 = vaddps_avx512vl(auVar118,auVar118);
    auVar121 = vmulps_avx512vl(auVar101,auVar101);
    local_5e0 = vsubps_avx512vl(auVar119,auVar121);
    auVar99 = vsubps_avx512vl(local_5e0,auVar99);
    local_500 = vmulps_avx512vl(auVar118,auVar118);
    _local_520 = vmulps_avx512vl(auVar113,auVar100);
    auVar100 = vmulps_avx512vl(_local_520,auVar99);
    auVar100 = vsubps_avx512vl(local_500,auVar100);
    uVar83 = vcmpps_avx512vl(auVar100,auVar122,5);
    bVar74 = (byte)uVar83;
    if (bVar74 == 0) {
LAB_019d147c:
      auVar265 = ZEXT3264(local_720);
      auVar269 = ZEXT3264(local_7c0);
      auVar268 = ZEXT3264(local_760);
      auVar267 = ZEXT3264(local_740);
      auVar266 = ZEXT3264(local_8e0);
      auVar264 = ZEXT3264(local_8c0);
      auVar263 = ZEXT3264(local_7e0);
      auVar262 = ZEXT3264(local_8a0);
      auVar261 = ZEXT3264(local_880);
      auVar260 = ZEXT3264(local_860);
      auVar259 = ZEXT3264(local_840);
      auVar258 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_800);
      auVar252 = ZEXT3264(auVar116);
      auVar270 = ZEXT3264(local_900);
    }
    else {
      auVar100 = vsqrtps_avx512vl(auVar100);
      auVar119 = vaddps_avx512vl(auVar113,auVar113);
      local_6a0 = vrcp14ps_avx512vl(auVar119);
      auVar121 = vfnmadd213ps_avx512vl(local_6a0,auVar119,auVar116);
      auVar121 = vfmadd132ps_avx512vl(auVar121,local_6a0,local_6a0);
      auVar30._8_4_ = 0x80000000;
      auVar30._0_8_ = 0x8000000080000000;
      auVar30._12_4_ = 0x80000000;
      auVar30._16_4_ = 0x80000000;
      auVar30._20_4_ = 0x80000000;
      auVar30._24_4_ = 0x80000000;
      auVar30._28_4_ = 0x80000000;
      _local_540 = vxorps_avx512vl(auVar118,auVar30);
      auVar122 = vsubps_avx512vl(_local_540,auVar100);
      local_440 = vmulps_avx512vl(auVar122,auVar121);
      auVar100 = vsubps_avx512vl(auVar100,auVar118);
      local_680 = vmulps_avx512vl(auVar100,auVar121);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = vblendmps_avx512vl(auVar100,local_440);
      auVar123._0_4_ =
           (uint)(bVar74 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar121._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar82 * auVar100._4_4_ | (uint)!bVar82 * auVar121._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar82 * auVar100._8_4_ | (uint)!bVar82 * auVar121._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar82 * auVar100._12_4_ | (uint)!bVar82 * auVar121._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar123._16_4_ = (uint)bVar82 * auVar100._16_4_ | (uint)!bVar82 * auVar121._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar123._20_4_ = (uint)bVar82 * auVar100._20_4_ | (uint)!bVar82 * auVar121._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar123._24_4_ = (uint)bVar82 * auVar100._24_4_ | (uint)!bVar82 * auVar121._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar123._28_4_ = (uint)bVar82 * auVar100._28_4_ | (uint)!bVar82 * auVar121._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar100,local_680);
      auVar124._0_4_ =
           (uint)(bVar74 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar100._0_4_;
      bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar82 * auVar121._4_4_ | (uint)!bVar82 * auVar100._4_4_;
      bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar82 * auVar121._8_4_ | (uint)!bVar82 * auVar100._8_4_;
      bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar82 * auVar121._12_4_ | (uint)!bVar82 * auVar100._12_4_;
      bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar82 * auVar121._16_4_ | (uint)!bVar82 * auVar100._16_4_;
      bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar82 * auVar121._20_4_ | (uint)!bVar82 * auVar100._20_4_;
      bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar82 * auVar121._24_4_ | (uint)!bVar82 * auVar100._24_4_;
      bVar82 = SUB81(uVar83 >> 7,0);
      auVar124._28_4_ = (uint)bVar82 * auVar121._28_4_ | (uint)!bVar82 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar96,auVar100);
      _local_460 = vmaxps_avx512vl(local_220,auVar100);
      auVar31._8_4_ = 0x36000000;
      auVar31._0_8_ = 0x3600000036000000;
      auVar31._12_4_ = 0x36000000;
      auVar31._16_4_ = 0x36000000;
      auVar31._20_4_ = 0x36000000;
      auVar31._24_4_ = 0x36000000;
      auVar31._28_4_ = 0x36000000;
      local_480 = vmulps_avx512vl(_local_460,auVar31);
      vandps_avx512vl(auVar113,auVar100);
      uVar77 = vcmpps_avx512vl(local_480,local_480,1);
      uVar83 = uVar83 & uVar77;
      bVar79 = (byte)uVar83;
      if (bVar79 != 0) {
        uVar77 = vcmpps_avx512vl(auVar99,_DAT_01f7b000,2);
        auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar96 = vblendmps_avx512vl(auVar99,auVar100);
        bVar80 = (byte)uVar77;
        uVar84 = (uint)(bVar80 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar80 & 1) * local_480._0_4_;
        bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
        uVar135 = (uint)bVar82 * auVar96._4_4_ | (uint)!bVar82 * local_480._4_4_;
        bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
        uVar136 = (uint)bVar82 * auVar96._8_4_ | (uint)!bVar82 * local_480._8_4_;
        bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
        uVar137 = (uint)bVar82 * auVar96._12_4_ | (uint)!bVar82 * local_480._12_4_;
        bVar82 = (bool)((byte)(uVar77 >> 4) & 1);
        uVar138 = (uint)bVar82 * auVar96._16_4_ | (uint)!bVar82 * local_480._16_4_;
        bVar82 = (bool)((byte)(uVar77 >> 5) & 1);
        uVar139 = (uint)bVar82 * auVar96._20_4_ | (uint)!bVar82 * local_480._20_4_;
        bVar82 = (bool)((byte)(uVar77 >> 6) & 1);
        uVar140 = (uint)bVar82 * auVar96._24_4_ | (uint)!bVar82 * local_480._24_4_;
        bVar82 = SUB81(uVar77 >> 7,0);
        uVar141 = (uint)bVar82 * auVar96._28_4_ | (uint)!bVar82 * local_480._28_4_;
        auVar123._0_4_ = (bVar79 & 1) * uVar84 | !(bool)(bVar79 & 1) * auVar123._0_4_;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar123._4_4_ = bVar82 * uVar135 | !bVar82 * auVar123._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar123._8_4_ = bVar82 * uVar136 | !bVar82 * auVar123._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar123._12_4_ = bVar82 * uVar137 | !bVar82 * auVar123._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar123._16_4_ = bVar82 * uVar138 | !bVar82 * auVar123._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar123._20_4_ = bVar82 * uVar139 | !bVar82 * auVar123._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar123._24_4_ = bVar82 * uVar140 | !bVar82 * auVar123._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar123._28_4_ = bVar82 * uVar141 | !bVar82 * auVar123._28_4_;
        auVar99 = vblendmps_avx512vl(auVar100,auVar99);
        bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar77 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
        bVar11 = SUB81(uVar77 >> 7,0);
        auVar124._0_4_ =
             (uint)(bVar79 & 1) *
             ((uint)(bVar80 & 1) * auVar99._0_4_ | !(bool)(bVar80 & 1) * uVar84) |
             !(bool)(bVar79 & 1) * auVar124._0_4_;
        bVar5 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar124._4_4_ =
             (uint)bVar5 * ((uint)bVar82 * auVar99._4_4_ | !bVar82 * uVar135) |
             !bVar5 * auVar124._4_4_;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar124._8_4_ =
             (uint)bVar82 * ((uint)bVar6 * auVar99._8_4_ | !bVar6 * uVar136) |
             !bVar82 * auVar124._8_4_;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar124._12_4_ =
             (uint)bVar82 * ((uint)bVar7 * auVar99._12_4_ | !bVar7 * uVar137) |
             !bVar82 * auVar124._12_4_;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar124._16_4_ =
             (uint)bVar82 * ((uint)bVar8 * auVar99._16_4_ | !bVar8 * uVar138) |
             !bVar82 * auVar124._16_4_;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar124._20_4_ =
             (uint)bVar82 * ((uint)bVar9 * auVar99._20_4_ | !bVar9 * uVar139) |
             !bVar82 * auVar124._20_4_;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar124._24_4_ =
             (uint)bVar82 * ((uint)bVar10 * auVar99._24_4_ | !bVar10 * uVar140) |
             !bVar82 * auVar124._24_4_;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar124._28_4_ =
             (uint)bVar82 * ((uint)bVar11 * auVar99._28_4_ | !bVar11 * uVar141) |
             !bVar82 * auVar124._28_4_;
        bVar74 = (~bVar79 | bVar80) & bVar74;
      }
      auVar70._4_4_ = uStack_41c;
      auVar70._0_4_ = local_420;
      auVar70._8_4_ = uStack_418;
      auVar70._12_4_ = uStack_414;
      auVar70._16_4_ = uStack_410;
      auVar70._20_4_ = uStack_40c;
      auVar70._24_4_ = uStack_408;
      auVar70._28_4_ = uStack_404;
      if ((bVar74 & 0x7f) == 0) {
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar116._16_4_ = 0x3f800000;
        auVar116._20_4_ = 0x3f800000;
        auVar116._24_4_ = 0x3f800000;
        auVar116._28_4_ = 0x3f800000;
        goto LAB_019d147c;
      }
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar112 = vxorps_avx512vl(auVar112,auVar96);
      auVar110 = vxorps_avx512vl(auVar110,auVar96);
      auVar111 = vxorps_avx512vl(auVar111,auVar96);
      auVar87 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_4e0);
      auVar99 = vbroadcastss_avx512vl(auVar87);
      auVar99 = vmaxps_avx512vl(auVar99,auVar123);
      auVar87 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_4e0);
      auVar100 = vbroadcastss_avx512vl(auVar87);
      auVar100 = vminps_avx512vl(auVar100,auVar124);
      auVar113 = vmulps_avx512vl(auVar53,auVar117);
      auVar113 = vfmadd213ps_avx512vl(auVar115,auVar52,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar114,auVar97,auVar113);
      auVar114 = vmulps_avx512vl(auVar70,auVar53);
      auVar265 = ZEXT3264(local_720);
      auVar114 = vfmadd231ps_avx512vl(auVar114,local_720,auVar52);
      auVar97 = vfmadd231ps_avx512vl(auVar114,local_3a0,auVar97);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar114);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar114,auVar115,1);
      auVar113 = vxorps_avx512vl(auVar113,auVar96);
      auVar117 = vrcp14ps_avx512vl(auVar97);
      auVar121 = vxorps_avx512vl(auVar97,auVar96);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar117,auVar97,auVar116);
      auVar87 = vfmadd132ps_fma(auVar122,auVar117,auVar117);
      fVar202 = auVar87._0_4_ * auVar113._0_4_;
      fVar142 = auVar87._4_4_ * auVar113._4_4_;
      auVar56._4_4_ = fVar142;
      auVar56._0_4_ = fVar202;
      fVar243 = auVar87._8_4_ * auVar113._8_4_;
      auVar56._8_4_ = fVar243;
      fVar244 = auVar87._12_4_ * auVar113._12_4_;
      auVar56._12_4_ = fVar244;
      fVar245 = auVar113._16_4_ * 0.0;
      auVar56._16_4_ = fVar245;
      fVar220 = auVar113._20_4_ * 0.0;
      auVar56._20_4_ = fVar220;
      fVar221 = auVar113._24_4_ * 0.0;
      auVar56._24_4_ = fVar221;
      auVar56._28_4_ = auVar113._28_4_;
      uVar17 = vcmpps_avx512vl(auVar97,auVar121,1);
      bVar79 = (byte)uVar15 | (byte)uVar17;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar125 = vblendmps_avx512vl(auVar56,auVar122);
      auVar126._0_4_ =
           (uint)(bVar79 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar117._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar82 * auVar125._4_4_ | (uint)!bVar82 * auVar117._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar82 * auVar125._8_4_ | (uint)!bVar82 * auVar117._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar82 * auVar125._12_4_ | (uint)!bVar82 * auVar117._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar82 * auVar125._16_4_ | (uint)!bVar82 * auVar117._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar82 * auVar125._20_4_ | (uint)!bVar82 * auVar117._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar82 * auVar125._24_4_ | (uint)!bVar82 * auVar117._24_4_;
      auVar126._28_4_ =
           (uint)(bVar79 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar117._28_4_;
      auVar117 = vmaxps_avx512vl(auVar99,auVar126);
      uVar17 = vcmpps_avx512vl(auVar97,auVar121,6);
      bVar79 = (byte)uVar15 | (byte)uVar17;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar127._0_4_ =
           (uint)(bVar79 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar202;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar82 * auVar121._4_4_ | (uint)!bVar82 * (int)fVar142;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar82 * auVar121._8_4_ | (uint)!bVar82 * (int)fVar243;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar82 * auVar121._12_4_ | (uint)!bVar82 * (int)fVar244;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar82 * auVar121._16_4_ | (uint)!bVar82 * (int)fVar245;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar82 * auVar121._20_4_ | (uint)!bVar82 * (int)fVar220;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar82 * auVar121._24_4_ | (uint)!bVar82 * (int)fVar221;
      auVar127._28_4_ =
           (uint)(bVar79 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar113._28_4_;
      auVar113 = vminps_avx512vl(auVar100,auVar127);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
      auVar100 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
      auVar125 = ZEXT832(0) << 0x20;
      auVar97 = vsubps_avx(auVar125,auVar95);
      auVar97 = vmulps_avx512vl(auVar97,auVar112);
      auVar100 = vfmadd231ps_avx512vl(auVar97,auVar111,auVar100);
      auVar99 = vfmadd231ps_avx512vl(auVar100,auVar110,auVar99);
      auVar100 = vmulps_avx512vl(auVar70,auVar112);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_720,auVar111);
      auVar100 = vfmadd231ps_avx512vl(auVar100,local_3a0,auVar110);
      vandps_avx512vl(auVar100,auVar114);
      uVar15 = vcmpps_avx512vl(auVar100,auVar115,1);
      auVar99 = vxorps_avx512vl(auVar99,auVar96);
      auVar97 = vrcp14ps_avx512vl(auVar100);
      auVar108 = vxorps_avx512vl(auVar100,auVar96);
      auVar249 = ZEXT3264(auVar108);
      auVar109 = vfnmadd213ps_avx512vl(auVar97,auVar100,auVar116);
      auVar87 = vfmadd132ps_fma(auVar109,auVar97,auVar97);
      auVar254 = ZEXT1664(auVar87);
      fVar202 = auVar87._0_4_ * auVar99._0_4_;
      fVar142 = auVar87._4_4_ * auVar99._4_4_;
      auVar57._4_4_ = fVar142;
      auVar57._0_4_ = fVar202;
      fVar243 = auVar87._8_4_ * auVar99._8_4_;
      auVar57._8_4_ = fVar243;
      fVar244 = auVar87._12_4_ * auVar99._12_4_;
      auVar57._12_4_ = fVar244;
      fVar245 = auVar99._16_4_ * 0.0;
      auVar57._16_4_ = fVar245;
      fVar220 = auVar99._20_4_ * 0.0;
      auVar57._20_4_ = fVar220;
      fVar221 = auVar99._24_4_ * 0.0;
      auVar57._24_4_ = fVar221;
      auVar57._28_4_ = auVar99._28_4_;
      uVar17 = vcmpps_avx512vl(auVar100,auVar108,1);
      bVar79 = (byte)uVar15 | (byte)uVar17;
      auVar109 = vblendmps_avx512vl(auVar57,auVar122);
      auVar128._0_4_ =
           (uint)(bVar79 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar79 & 1) * auVar97._0_4_;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar128._4_4_ = (uint)bVar82 * auVar109._4_4_ | (uint)!bVar82 * auVar97._4_4_;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar128._8_4_ = (uint)bVar82 * auVar109._8_4_ | (uint)!bVar82 * auVar97._8_4_;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar128._12_4_ = (uint)bVar82 * auVar109._12_4_ | (uint)!bVar82 * auVar97._12_4_;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar128._16_4_ = (uint)bVar82 * auVar109._16_4_ | (uint)!bVar82 * auVar97._16_4_;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar128._20_4_ = (uint)bVar82 * auVar109._20_4_ | (uint)!bVar82 * auVar97._20_4_;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar128._24_4_ = (uint)bVar82 * auVar109._24_4_ | (uint)!bVar82 * auVar97._24_4_;
      auVar128._28_4_ =
           (uint)(bVar79 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar97._28_4_;
      local_400 = vmaxps_avx(auVar117,auVar128);
      auVar246 = ZEXT3264(local_400);
      uVar17 = vcmpps_avx512vl(auVar100,auVar108,6);
      bVar79 = (byte)uVar15 | (byte)uVar17;
      auVar129._0_4_ =
           (uint)(bVar79 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar79 & 1) * (int)fVar202;
      bVar82 = (bool)(bVar79 >> 1 & 1);
      auVar129._4_4_ = (uint)bVar82 * auVar121._4_4_ | (uint)!bVar82 * (int)fVar142;
      bVar82 = (bool)(bVar79 >> 2 & 1);
      auVar129._8_4_ = (uint)bVar82 * auVar121._8_4_ | (uint)!bVar82 * (int)fVar243;
      bVar82 = (bool)(bVar79 >> 3 & 1);
      auVar129._12_4_ = (uint)bVar82 * auVar121._12_4_ | (uint)!bVar82 * (int)fVar244;
      bVar82 = (bool)(bVar79 >> 4 & 1);
      auVar129._16_4_ = (uint)bVar82 * auVar121._16_4_ | (uint)!bVar82 * (int)fVar245;
      bVar82 = (bool)(bVar79 >> 5 & 1);
      auVar129._20_4_ = (uint)bVar82 * auVar121._20_4_ | (uint)!bVar82 * (int)fVar220;
      bVar82 = (bool)(bVar79 >> 6 & 1);
      auVar129._24_4_ = (uint)bVar82 * auVar121._24_4_ | (uint)!bVar82 * (int)fVar221;
      auVar129._28_4_ =
           (uint)(bVar79 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar79 >> 7) * auVar99._28_4_;
      local_300 = vminps_avx(auVar113,auVar129);
      auVar242 = ZEXT3264(local_300);
      uVar15 = vcmpps_avx512vl(local_400,local_300,2);
      bVar74 = bVar74 & 0x7f & (byte)uVar15;
      if (bVar74 == 0) goto LAB_019d147c;
      auVar99 = vmaxps_avx(auVar125,local_920);
      auVar100 = vfmadd213ps_avx512vl(local_440,auVar120,auVar101);
      fVar202 = auVar98._0_4_;
      fVar142 = auVar98._4_4_;
      auVar58._4_4_ = fVar142 * auVar100._4_4_;
      auVar58._0_4_ = fVar202 * auVar100._0_4_;
      fVar243 = auVar98._8_4_;
      auVar58._8_4_ = fVar243 * auVar100._8_4_;
      fVar244 = auVar98._12_4_;
      auVar58._12_4_ = fVar244 * auVar100._12_4_;
      fVar245 = auVar98._16_4_;
      auVar58._16_4_ = fVar245 * auVar100._16_4_;
      fVar220 = auVar98._20_4_;
      auVar58._20_4_ = fVar220 * auVar100._20_4_;
      fVar221 = auVar98._24_4_;
      auVar58._24_4_ = fVar221 * auVar100._24_4_;
      auVar58._28_4_ = auVar100._28_4_;
      auVar100 = vfmadd213ps_avx512vl(local_680,auVar120,auVar101);
      auVar59._4_4_ = fVar142 * auVar100._4_4_;
      auVar59._0_4_ = fVar202 * auVar100._0_4_;
      auVar59._8_4_ = fVar243 * auVar100._8_4_;
      auVar59._12_4_ = fVar244 * auVar100._12_4_;
      auVar59._16_4_ = fVar245 * auVar100._16_4_;
      auVar59._20_4_ = fVar220 * auVar100._20_4_;
      auVar59._24_4_ = fVar221 * auVar100._24_4_;
      auVar59._28_4_ = auVar100._28_4_;
      auVar100 = vminps_avx512vl(auVar58,auVar116);
      auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar100 = vmaxps_avx(auVar100,ZEXT832(0) << 0x20);
      auVar108 = vminps_avx512vl(auVar59,auVar116);
      auVar60._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar100._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar60,local_700,local_7a0);
      auVar100 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
      auVar61._4_4_ = (auVar100._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar100._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar100._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar100._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar100._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar100._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar100._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar100._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar61,local_700,local_7a0);
      auVar62._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar62._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar62._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar62._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar62._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar62._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar62._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar62._28_4_ = auVar99._28_4_;
      auVar100 = vsubps_avx(local_5e0,auVar62);
      auVar63._4_4_ = auVar100._4_4_ * (float)local_520._4_4_;
      auVar63._0_4_ = auVar100._0_4_ * (float)local_520._0_4_;
      auVar63._8_4_ = auVar100._8_4_ * fStack_518;
      auVar63._12_4_ = auVar100._12_4_ * fStack_514;
      auVar63._16_4_ = auVar100._16_4_ * fStack_510;
      auVar63._20_4_ = auVar100._20_4_ * fStack_50c;
      auVar63._24_4_ = auVar100._24_4_ * fStack_508;
      auVar63._28_4_ = auVar99._28_4_;
      auVar99 = vsubps_avx(local_500,auVar63);
      uVar15 = vcmpps_avx512vl(auVar99,ZEXT832(0) << 0x20,5);
      bVar79 = (byte)uVar15;
      auVar267 = ZEXT3264(local_740);
      auVar268 = ZEXT3264(local_760);
      auVar269 = ZEXT3264(local_7c0);
      if (bVar79 == 0) {
        bVar79 = 0;
        auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar252 = ZEXT864(0) << 0x20;
        auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar109 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar246 = ZEXT864(0) << 0x20;
        auVar130._8_4_ = 0x7f800000;
        auVar130._0_8_ = 0x7f8000007f800000;
        auVar130._12_4_ = 0x7f800000;
        auVar130._16_4_ = 0x7f800000;
        auVar130._20_4_ = 0x7f800000;
        auVar130._24_4_ = 0x7f800000;
        auVar130._28_4_ = 0x7f800000;
        auVar131._8_4_ = 0xff800000;
        auVar131._0_8_ = 0xff800000ff800000;
        auVar131._12_4_ = 0xff800000;
        auVar131._16_4_ = 0xff800000;
        auVar131._20_4_ = 0xff800000;
        auVar131._24_4_ = 0xff800000;
        auVar131._28_4_ = 0xff800000;
      }
      else {
        auVar88 = vxorps_avx512vl(auVar145,auVar145);
        uVar83 = vcmpps_avx512vl(auVar99,auVar125,5);
        auVar99 = vsqrtps_avx(auVar99);
        auVar97 = vfnmadd213ps_avx512vl(auVar119,local_6a0,auVar116);
        auVar109 = vfmadd132ps_avx512vl(auVar97,local_6a0,local_6a0);
        auVar97 = vsubps_avx(_local_540,auVar99);
        auVar95 = vmulps_avx512vl(auVar97,auVar109);
        auVar99 = vsubps_avx512vl(auVar99,auVar118);
        auVar96 = vmulps_avx512vl(auVar99,auVar109);
        auVar99 = vfmadd213ps_avx512vl(auVar120,auVar95,auVar101);
        auVar64._4_4_ = fVar142 * auVar99._4_4_;
        auVar64._0_4_ = fVar202 * auVar99._0_4_;
        auVar64._8_4_ = fVar243 * auVar99._8_4_;
        auVar64._12_4_ = fVar244 * auVar99._12_4_;
        auVar64._16_4_ = fVar245 * auVar99._16_4_;
        auVar64._20_4_ = fVar220 * auVar99._20_4_;
        auVar64._24_4_ = fVar221 * auVar99._24_4_;
        auVar64._28_4_ = auVar108._28_4_;
        auVar99 = vmulps_avx512vl(local_3a0,auVar95);
        auVar97 = vmulps_avx512vl(local_720,auVar95);
        auVar71._4_4_ = uStack_41c;
        auVar71._0_4_ = local_420;
        auVar71._8_4_ = uStack_418;
        auVar71._12_4_ = uStack_414;
        auVar71._16_4_ = uStack_410;
        auVar71._20_4_ = uStack_40c;
        auVar71._24_4_ = uStack_408;
        auVar71._28_4_ = uStack_404;
        auVar110 = vmulps_avx512vl(auVar71,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar102,auVar64,auVar104);
        auVar108 = vsubps_avx512vl(auVar99,auVar108);
        auVar99 = vfmadd213ps_avx512vl(auVar103,auVar64,auVar105);
        auVar109 = vsubps_avx512vl(auVar97,auVar99);
        auVar87 = vfmadd213ps_fma(auVar64,auVar107,auVar106);
        auVar99 = vsubps_avx(auVar110,ZEXT1632(auVar87));
        auVar246 = ZEXT3264(auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar120,auVar96,auVar101);
        auVar65._4_4_ = fVar142 * auVar99._4_4_;
        auVar65._0_4_ = fVar202 * auVar99._0_4_;
        auVar65._8_4_ = fVar243 * auVar99._8_4_;
        auVar65._12_4_ = fVar244 * auVar99._12_4_;
        auVar65._16_4_ = fVar245 * auVar99._16_4_;
        auVar65._20_4_ = fVar220 * auVar99._20_4_;
        auVar65._24_4_ = fVar221 * auVar99._24_4_;
        auVar65._28_4_ = auVar98._28_4_;
        auVar99 = vmulps_avx512vl(local_3a0,auVar96);
        auVar98 = vmulps_avx512vl(local_720,auVar96);
        auVar101 = vmulps_avx512vl(auVar71,auVar96);
        auVar87 = vfmadd213ps_fma(auVar102,auVar65,auVar104);
        auVar97 = vsubps_avx(auVar99,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar103,auVar65,auVar105);
        auVar99 = vsubps_avx(auVar98,ZEXT1632(auVar87));
        auVar87 = vfmadd213ps_fma(auVar107,auVar65,auVar106);
        auVar98 = vsubps_avx512vl(auVar101,ZEXT1632(auVar87));
        auVar252 = ZEXT3264(auVar98);
        auVar153._8_4_ = 0x7f800000;
        auVar153._0_8_ = 0x7f8000007f800000;
        auVar153._12_4_ = 0x7f800000;
        auVar153._16_4_ = 0x7f800000;
        auVar153._20_4_ = 0x7f800000;
        auVar153._24_4_ = 0x7f800000;
        auVar153._28_4_ = 0x7f800000;
        auVar98 = vblendmps_avx512vl(auVar153,auVar95);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar130._0_4_ = (uint)bVar82 * auVar98._0_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 0x7f800000;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar130._28_4_ = (uint)bVar82 * auVar98._28_4_ | (uint)!bVar82 * 0x7f800000;
        auVar194._8_4_ = 0xff800000;
        auVar194._0_8_ = 0xff800000ff800000;
        auVar194._12_4_ = 0xff800000;
        auVar194._16_4_ = 0xff800000;
        auVar194._20_4_ = 0xff800000;
        auVar194._24_4_ = 0xff800000;
        auVar194._28_4_ = 0xff800000;
        auVar98 = vblendmps_avx512vl(auVar194,auVar96);
        bVar82 = (bool)((byte)uVar83 & 1);
        auVar131._0_4_ = (uint)bVar82 * auVar98._0_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * -0x800000;
        bVar82 = SUB81(uVar83 >> 7,0);
        auVar131._28_4_ = (uint)bVar82 * auVar98._28_4_ | (uint)!bVar82 * -0x800000;
        auVar32._8_4_ = 0x36000000;
        auVar32._0_8_ = 0x3600000036000000;
        auVar32._12_4_ = 0x36000000;
        auVar32._16_4_ = 0x36000000;
        auVar32._20_4_ = 0x36000000;
        auVar32._24_4_ = 0x36000000;
        auVar32._28_4_ = 0x36000000;
        auVar98 = vmulps_avx512vl(_local_460,auVar32);
        uVar77 = vcmpps_avx512vl(auVar98,local_480,0xe);
        uVar83 = uVar83 & uVar77;
        bVar80 = (byte)uVar83;
        if (bVar80 != 0) {
          uVar77 = vcmpps_avx512vl(auVar100,ZEXT1632(auVar88),2);
          auVar236._8_4_ = 0x7f800000;
          auVar236._0_8_ = 0x7f8000007f800000;
          auVar236._12_4_ = 0x7f800000;
          auVar236._16_4_ = 0x7f800000;
          auVar236._20_4_ = 0x7f800000;
          auVar236._24_4_ = 0x7f800000;
          auVar236._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          auVar101 = vblendmps_avx512vl(auVar236,auVar251);
          bVar75 = (byte)uVar77;
          uVar84 = (uint)(bVar75 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar98._0_4_;
          bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
          uVar135 = (uint)bVar82 * auVar101._4_4_ | (uint)!bVar82 * auVar98._4_4_;
          bVar82 = (bool)((byte)(uVar77 >> 2) & 1);
          uVar136 = (uint)bVar82 * auVar101._8_4_ | (uint)!bVar82 * auVar98._8_4_;
          bVar82 = (bool)((byte)(uVar77 >> 3) & 1);
          uVar137 = (uint)bVar82 * auVar101._12_4_ | (uint)!bVar82 * auVar98._12_4_;
          bVar82 = (bool)((byte)(uVar77 >> 4) & 1);
          uVar138 = (uint)bVar82 * auVar101._16_4_ | (uint)!bVar82 * auVar98._16_4_;
          bVar82 = (bool)((byte)(uVar77 >> 5) & 1);
          uVar139 = (uint)bVar82 * auVar101._20_4_ | (uint)!bVar82 * auVar98._20_4_;
          bVar82 = (bool)((byte)(uVar77 >> 6) & 1);
          uVar140 = (uint)bVar82 * auVar101._24_4_ | (uint)!bVar82 * auVar98._24_4_;
          bVar82 = SUB81(uVar77 >> 7,0);
          uVar141 = (uint)bVar82 * auVar101._28_4_ | (uint)!bVar82 * auVar98._28_4_;
          auVar130._0_4_ = (bVar80 & 1) * uVar84 | !(bool)(bVar80 & 1) * auVar130._0_4_;
          bVar82 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar130._4_4_ = bVar82 * uVar135 | !bVar82 * auVar130._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar130._8_4_ = bVar82 * uVar136 | !bVar82 * auVar130._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar130._12_4_ = bVar82 * uVar137 | !bVar82 * auVar130._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar130._16_4_ = bVar82 * uVar138 | !bVar82 * auVar130._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar130._20_4_ = bVar82 * uVar139 | !bVar82 * auVar130._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar130._24_4_ = bVar82 * uVar140 | !bVar82 * auVar130._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar130._28_4_ = bVar82 * uVar141 | !bVar82 * auVar130._28_4_;
          auVar98 = vblendmps_avx512vl(auVar251,auVar236);
          bVar82 = (bool)((byte)(uVar77 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar77 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar77 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar77 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar77 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar77 >> 6) & 1);
          bVar11 = SUB81(uVar77 >> 7,0);
          auVar131._0_4_ =
               (uint)(bVar80 & 1) *
               ((uint)(bVar75 & 1) * auVar98._0_4_ | !(bool)(bVar75 & 1) * uVar84) |
               !(bool)(bVar80 & 1) * auVar131._0_4_;
          bVar5 = (bool)((byte)(uVar83 >> 1) & 1);
          auVar131._4_4_ =
               (uint)bVar5 * ((uint)bVar82 * auVar98._4_4_ | !bVar82 * uVar135) |
               !bVar5 * auVar131._4_4_;
          bVar82 = (bool)((byte)(uVar83 >> 2) & 1);
          auVar131._8_4_ =
               (uint)bVar82 * ((uint)bVar6 * auVar98._8_4_ | !bVar6 * uVar136) |
               !bVar82 * auVar131._8_4_;
          bVar82 = (bool)((byte)(uVar83 >> 3) & 1);
          auVar131._12_4_ =
               (uint)bVar82 * ((uint)bVar7 * auVar98._12_4_ | !bVar7 * uVar137) |
               !bVar82 * auVar131._12_4_;
          bVar82 = (bool)((byte)(uVar83 >> 4) & 1);
          auVar131._16_4_ =
               (uint)bVar82 * ((uint)bVar8 * auVar98._16_4_ | !bVar8 * uVar138) |
               !bVar82 * auVar131._16_4_;
          bVar82 = (bool)((byte)(uVar83 >> 5) & 1);
          auVar131._20_4_ =
               (uint)bVar82 * ((uint)bVar9 * auVar98._20_4_ | !bVar9 * uVar139) |
               !bVar82 * auVar131._20_4_;
          bVar82 = (bool)((byte)(uVar83 >> 6) & 1);
          auVar131._24_4_ =
               (uint)bVar82 * ((uint)bVar10 * auVar98._24_4_ | !bVar10 * uVar140) |
               !bVar82 * auVar131._24_4_;
          bVar82 = SUB81(uVar83 >> 7,0);
          auVar131._28_4_ =
               (uint)bVar82 * ((uint)bVar11 * auVar98._28_4_ | !bVar11 * uVar141) |
               !bVar82 * auVar131._28_4_;
          bVar79 = (~bVar80 | bVar75) & bVar79;
        }
      }
      auVar263 = ZEXT3264(local_7e0);
      auVar257 = ZEXT3264(local_800);
      auVar258 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_840);
      auVar260 = ZEXT3264(local_860);
      auVar261 = ZEXT3264(local_880);
      auVar262 = ZEXT3264(local_8a0);
      auVar264 = ZEXT3264(local_8c0);
      auVar266 = ZEXT3264(local_8e0);
      auVar270 = ZEXT3264(local_900);
      uVar144 = *(undefined4 *)&(ray->dir).field_0;
      auVar233._4_4_ = uVar144;
      auVar233._0_4_ = uVar144;
      auVar233._8_4_ = uVar144;
      auVar233._12_4_ = uVar144;
      auVar233._16_4_ = uVar144;
      auVar233._20_4_ = uVar144;
      auVar233._24_4_ = uVar144;
      auVar233._28_4_ = uVar144;
      uVar144 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar237._4_4_ = uVar144;
      auVar237._0_4_ = uVar144;
      auVar237._8_4_ = uVar144;
      auVar237._12_4_ = uVar144;
      auVar237._16_4_ = uVar144;
      auVar237._20_4_ = uVar144;
      auVar237._24_4_ = uVar144;
      auVar237._28_4_ = uVar144;
      auVar238 = ZEXT3264(auVar237);
      fVar202 = (ray->dir).field_0.m128[2];
      auVar254._0_4_ = fVar202 * auVar252._0_4_;
      auVar254._4_4_ = fVar202 * auVar252._4_4_;
      auVar254._8_4_ = fVar202 * auVar252._8_4_;
      auVar254._12_4_ = fVar202 * auVar252._12_4_;
      auVar254._16_4_ = fVar202 * auVar252._16_4_;
      auVar254._20_4_ = fVar202 * auVar252._20_4_;
      auVar254._28_36_ = auVar252._28_36_;
      auVar254._24_4_ = fVar202 * auVar252._24_4_;
      auVar87 = vfmadd231ps_fma(auVar254._0_32_,auVar237,auVar99);
      auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar233,auVar97);
      auVar248._8_4_ = 0x7fffffff;
      auVar248._0_8_ = 0x7fffffff7fffffff;
      auVar248._12_4_ = 0x7fffffff;
      auVar248._16_4_ = 0x7fffffff;
      auVar248._20_4_ = 0x7fffffff;
      auVar248._24_4_ = 0x7fffffff;
      auVar248._28_4_ = 0x7fffffff;
      auVar249 = ZEXT3264(auVar248);
      auVar99 = vandps_avx(auVar248,ZEXT1632(auVar87));
      auVar254 = ZEXT3264(local_400);
      _local_2e0 = local_400;
      auVar230._8_4_ = 0x3e99999a;
      auVar230._0_8_ = 0x3e99999a3e99999a;
      auVar230._12_4_ = 0x3e99999a;
      auVar230._16_4_ = 0x3e99999a;
      auVar230._20_4_ = 0x3e99999a;
      auVar230._24_4_ = 0x3e99999a;
      auVar230._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar99,auVar230,1);
      _local_3c0 = vmaxps_avx(local_400,auVar131);
      auVar231 = ZEXT3264(_local_3c0);
      auVar99 = vminps_avx(local_300,auVar130);
      uVar17 = vcmpps_avx512vl(local_400,auVar99,2);
      bVar80 = (byte)uVar17 & bVar74;
      uVar16 = vcmpps_avx512vl(_local_3c0,local_300,2);
      if ((bVar74 & ((byte)uVar16 | (byte)uVar17)) == 0) {
        auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
      }
      else {
        local_768 = (uint)(byte)((byte)uVar15 | ~bVar79);
        auVar66._4_4_ = auVar246._4_4_ * fVar202;
        auVar66._0_4_ = auVar246._0_4_ * fVar202;
        auVar66._8_4_ = auVar246._8_4_ * fVar202;
        auVar66._12_4_ = auVar246._12_4_ * fVar202;
        auVar66._16_4_ = auVar246._16_4_ * fVar202;
        auVar66._20_4_ = auVar246._20_4_ * fVar202;
        auVar66._24_4_ = auVar246._24_4_ * fVar202;
        auVar66._28_4_ = auVar99._28_4_;
        auVar87 = vfmadd213ps_fma(auVar109,auVar237,auVar66);
        auVar87 = vfmadd213ps_fma(auVar108,auVar233,ZEXT1632(auVar87));
        auVar99 = vandps_avx(auVar248,ZEXT1632(auVar87));
        uVar15 = vcmpps_avx512vl(auVar99,auVar230,1);
        bVar79 = (byte)uVar15 | ~bVar79;
        auVar156._8_4_ = 2;
        auVar156._0_8_ = 0x200000002;
        auVar156._12_4_ = 2;
        auVar156._16_4_ = 2;
        auVar156._20_4_ = 2;
        auVar156._24_4_ = 2;
        auVar156._28_4_ = 2;
        auVar33._8_4_ = 3;
        auVar33._0_8_ = 0x300000003;
        auVar33._12_4_ = 3;
        auVar33._16_4_ = 3;
        auVar33._20_4_ = 3;
        auVar33._24_4_ = 3;
        auVar33._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar156,auVar33);
        local_2a0._0_4_ = (uint)(bVar79 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
        bVar82 = (bool)(bVar79 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar82 * auVar99._4_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar82 * auVar99._8_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar82 * auVar99._12_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar82 * auVar99._16_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar82 * auVar99._20_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)(bVar79 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar82 * auVar99._24_4_ | (uint)!bVar82 * 2;
        local_2a0._28_4_ = (uint)(bVar79 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar79 >> 7) * 2;
        local_340 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_340,local_2a0,5);
        local_764 = (uint)bVar80;
        local_380 = local_400._0_4_ + (float)local_3e0._0_4_;
        fStack_37c = local_400._4_4_ + (float)local_3e0._4_4_;
        fStack_378 = local_400._8_4_ + fStack_3d8;
        fStack_374 = local_400._12_4_ + fStack_3d4;
        fStack_370 = local_400._16_4_ + fStack_3d0;
        fStack_36c = local_400._20_4_ + fStack_3cc;
        fStack_368 = local_400._24_4_ + fStack_3c8;
        fStack_364 = local_400._28_4_ + fStack_3c4;
        _local_320 = _local_3c0;
        for (bVar80 = (byte)uVar15 & bVar80; auVar99 = local_920, bVar80 != 0;
            bVar80 = ~bVar79 & bVar80 & (byte)uVar15) {
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar157,local_400);
          auVar133._0_4_ =
               (uint)(bVar80 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar80 & 1) * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar80 >> 6 & 1);
          auVar133._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 0x7f800000;
          auVar133._28_4_ =
               (uint)(bVar80 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
          auVar98 = vshufps_avx(auVar133,auVar133,0xb1);
          auVar98 = vminps_avx(auVar133,auVar98);
          auVar101 = vshufpd_avx(auVar98,auVar98,5);
          auVar98 = vminps_avx(auVar98,auVar101);
          auVar101 = vpermpd_avx2(auVar98,0x4e);
          auVar98 = vminps_avx(auVar98,auVar101);
          uVar15 = vcmpps_avx512vl(auVar133,auVar98,0);
          bVar75 = (byte)uVar15 & bVar80;
          bVar79 = bVar80;
          if (bVar75 != 0) {
            bVar79 = bVar75;
          }
          iVar18 = 0;
          for (uVar84 = (uint)bVar79; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar79 = '\x01' << ((byte)iVar18 & 0x1f);
          auVar238 = ZEXT464(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
          aVar1 = (ray->dir).field_0;
          local_500._0_16_ = (undefined1  [16])aVar1;
          auVar87 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar87._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar80;
            local_920._2_30_ = auVar99._2_30_;
            local_7a0._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar18 << 2)));
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar249 = ZEXT1664(auVar249._0_16_);
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar202 = sqrtf(auVar87._0_4_);
            auVar238 = ZEXT1664(local_700._0_16_);
            bVar80 = local_920[0];
            auVar270 = ZEXT3264(local_900);
            auVar269 = ZEXT3264(local_7c0);
            auVar268 = ZEXT3264(local_760);
            auVar267 = ZEXT3264(local_740);
            auVar266 = ZEXT3264(local_8e0);
            auVar264 = ZEXT3264(local_8c0);
            auVar262 = ZEXT3264(local_8a0);
            auVar261 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_860);
            auVar259 = ZEXT3264(local_840);
            auVar258 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_800);
            auVar263 = ZEXT3264(local_7e0);
            auVar265 = ZEXT3264(local_720);
            auVar87 = local_7a0._0_16_;
          }
          else {
            auVar87 = vsqrtss_avx(auVar87,auVar87);
            fVar202 = auVar87._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar18 << 2)));
          }
          uVar83 = (ulong)bVar79;
          auVar92 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar88 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar231 = ZEXT3264(_local_5c0);
          auVar93 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar85 = vminps_avx(auVar92,auVar93);
          auVar92 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar93 = vmaxps_avx(auVar88,auVar92);
          auVar203._8_4_ = 0x7fffffff;
          auVar203._0_8_ = 0x7fffffff7fffffff;
          auVar203._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar85,auVar203);
          auVar92 = vandps_avx(auVar93,auVar203);
          auVar88 = vmaxps_avx(auVar88,auVar92);
          auVar92 = vmovshdup_avx(auVar88);
          auVar92 = vmaxss_avx(auVar92,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar92);
          local_650 = auVar88._0_4_ * 1.9073486e-06;
          local_4d0 = vshufps_avx(auVar93,auVar93,0xff);
          auVar87 = vinsertps_avx(auVar238._0_16_,auVar87,0x10);
          auVar246 = ZEXT1664(auVar87);
          uVar77 = 0;
          while( true ) {
            bVar75 = (byte)uVar83;
            if (uVar77 == 5) break;
            uVar144 = auVar246._0_4_;
            auVar147._4_4_ = uVar144;
            auVar147._0_4_ = uVar144;
            auVar147._8_4_ = uVar144;
            auVar147._12_4_ = uVar144;
            auVar88 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_500._0_16_);
            _local_520 = auVar246._0_16_;
            auVar87 = vmovshdup_avx(auVar246._0_16_);
            fVar220 = auVar87._0_4_;
            fVar245 = 1.0 - fVar220;
            fVar244 = fVar245 * fVar245 * fVar245;
            fVar142 = fVar220 * fVar220;
            fVar221 = fVar142 * fVar220;
            auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar244),
                                      ZEXT416((uint)fVar221));
            fVar243 = fVar220 * fVar245;
            local_7a0._0_16_ = ZEXT416((uint)fVar245);
            local_920._0_16_ = auVar87;
            auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar220 * 6.0)),
                                      ZEXT416((uint)(fVar243 * fVar245)),
                                      SUB6416(ZEXT464(0x41400000),0));
            auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                      ZEXT416((uint)fVar244));
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * fVar245 * 6.0)),
                                      SUB6416(ZEXT464(0x41400000),0),
                                      ZEXT416((uint)(fVar243 * fVar220)));
            fVar244 = fVar244 * 0.16666667;
            fVar245 = (auVar92._0_4_ + auVar93._0_4_) * 0.16666667;
            fVar220 = (auVar87._0_4_ + auVar85._0_4_) * 0.16666667;
            fVar221 = fVar221 * 0.16666667;
            auVar182._0_4_ = fVar221 * (float)local_5c0._0_4_;
            auVar182._4_4_ = fVar221 * (float)local_5c0._4_4_;
            auVar182._8_4_ = fVar221 * fStack_5b8;
            auVar182._12_4_ = fVar221 * fStack_5b4;
            auVar222._4_4_ = fVar220;
            auVar222._0_4_ = fVar220;
            auVar222._8_4_ = fVar220;
            auVar222._12_4_ = fVar220;
            auVar87 = vfmadd132ps_fma(auVar222,auVar182,local_580._0_16_);
            auVar183._4_4_ = fVar245;
            auVar183._0_4_ = fVar245;
            auVar183._8_4_ = fVar245;
            auVar183._12_4_ = fVar245;
            auVar87 = vfmadd132ps_fma(auVar183,auVar87,local_5a0._0_16_);
            auVar166._4_4_ = fVar244;
            auVar166._0_4_ = fVar244;
            auVar166._8_4_ = fVar244;
            auVar166._12_4_ = fVar244;
            auVar87 = vfmadd132ps_fma(auVar166,auVar87,local_560._0_16_);
            local_440._0_16_ = auVar87;
            auVar87 = vsubps_avx(auVar88,auVar87);
            local_700._0_16_ = auVar87;
            auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
            local_5e0._0_16_ = auVar87;
            if (auVar87._0_4_ < 0.0) {
              local_680._0_4_ = fVar142;
              local_6a0._0_4_ = fVar243;
              auVar252._0_4_ = sqrtf(auVar87._0_4_);
              auVar252._4_60_ = extraout_var;
              auVar87 = auVar252._0_16_;
              uVar83 = extraout_RAX;
              fVar243 = (float)local_6a0._0_4_;
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              local_680._0_4_ = fVar142;
            }
            local_540._4_4_ = local_7a0._0_4_;
            local_540._0_4_ = local_540._4_4_;
            fStack_538 = (float)local_540._4_4_;
            fStack_534 = (float)local_540._4_4_;
            auVar92 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                       ZEXT416((uint)(fVar243 * 4.0)));
            auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar243 * 4.0)),local_7a0._0_16_,
                                      local_7a0._0_16_);
            fVar142 = (float)local_540._4_4_ * -(float)local_540._4_4_ * 0.5;
            fVar243 = auVar92._0_4_ * 0.5;
            fVar244 = auVar88._0_4_ * 0.5;
            local_680._0_4_ = (float)local_680._0_4_ * 0.5;
            auVar204._0_4_ = (float)local_680._0_4_ * (float)local_5c0._0_4_;
            auVar204._4_4_ = (float)local_680._0_4_ * (float)local_5c0._4_4_;
            auVar204._8_4_ = (float)local_680._0_4_ * fStack_5b8;
            auVar204._12_4_ = (float)local_680._0_4_ * fStack_5b4;
            auVar167._4_4_ = fVar244;
            auVar167._0_4_ = fVar244;
            auVar167._8_4_ = fVar244;
            auVar167._12_4_ = fVar244;
            auVar88 = vfmadd132ps_fma(auVar167,auVar204,local_580._0_16_);
            auVar184._4_4_ = fVar243;
            auVar184._0_4_ = fVar243;
            auVar184._8_4_ = fVar243;
            auVar184._12_4_ = fVar243;
            auVar88 = vfmadd132ps_fma(auVar184,auVar88,local_5a0._0_16_);
            auVar253._4_4_ = fVar142;
            auVar253._0_4_ = fVar142;
            auVar253._8_4_ = fVar142;
            auVar253._12_4_ = fVar142;
            local_680._0_16_ = vfmadd132ps_fma(auVar253,auVar88,local_560._0_16_);
            _local_460 = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
            auVar67._12_4_ = 0;
            auVar67._0_12_ = ZEXT812(0);
            fVar142 = local_460._0_4_;
            local_640 = vrsqrt14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar142));
            fVar243 = local_640._0_4_;
            local_480._0_16_ = vrcp14ss_avx512f(auVar67 << 0x20,ZEXT416((uint)fVar142));
            auVar88 = vfnmadd213ss_fma(local_480._0_16_,_local_460,ZEXT416(0x40000000));
            local_490._0_4_ = auVar88._0_4_;
            local_6a0._0_4_ = auVar87._0_4_;
            if (fVar142 < -fVar142) {
              fVar244 = sqrtf(fVar142);
              auVar87 = ZEXT416((uint)local_6a0._0_4_);
              uVar83 = extraout_RAX_00;
              auVar88 = local_680._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(_local_460,_local_460);
              fVar244 = auVar88._0_4_;
              auVar88 = local_680._0_16_;
            }
            fVar245 = local_640._0_4_;
            fVar142 = fVar243 * 1.5 + fVar142 * -0.5 * fVar245 * fVar245 * fVar245;
            local_640._0_4_ = auVar88._0_4_ * fVar142;
            local_640._4_4_ = auVar88._4_4_ * fVar142;
            local_640._8_4_ = auVar88._8_4_ * fVar142;
            local_640._12_4_ = auVar88._12_4_ * fVar142;
            auVar92 = vdpps_avx(local_700._0_16_,local_640,0x7f);
            fVar245 = auVar87._0_4_;
            auVar148._0_4_ = auVar92._0_4_ * auVar92._0_4_;
            auVar148._4_4_ = auVar92._4_4_ * auVar92._4_4_;
            auVar148._8_4_ = auVar92._8_4_ * auVar92._8_4_;
            auVar148._12_4_ = auVar92._12_4_ * auVar92._12_4_;
            auVar93 = vsubps_avx(local_5e0._0_16_,auVar148);
            fVar243 = auVar93._0_4_;
            auVar168._4_12_ = ZEXT812(0) << 0x20;
            auVar168._0_4_ = fVar243;
            auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
            auVar89 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
            if (fVar243 < 0.0) {
              local_4c0._4_4_ = fVar142;
              local_4c0._0_4_ = fVar142;
              fStack_4b8 = fVar142;
              fStack_4b4 = fVar142;
              local_4b0 = auVar85;
              local_4a0 = auVar92;
              fVar220 = sqrtf(fVar243);
              auVar89 = ZEXT416(auVar89._0_4_);
              auVar87 = ZEXT416((uint)local_6a0._0_4_);
              uVar83 = extraout_RAX_01;
              auVar85 = local_4b0;
              auVar88 = local_680._0_16_;
              auVar92 = local_4a0;
              fVar142 = (float)local_4c0._0_4_;
              fVar221 = (float)local_4c0._4_4_;
              fVar164 = fStack_4b8;
              fVar179 = fStack_4b4;
            }
            else {
              auVar93 = vsqrtss_avx(auVar93,auVar93);
              fVar220 = auVar93._0_4_;
              fVar221 = fVar142;
              fVar164 = fVar142;
              fVar179 = fVar142;
            }
            auVar254 = ZEXT1664(auVar88);
            auVar249 = ZEXT1664(local_700._0_16_);
            auVar265 = ZEXT3264(local_720);
            auVar263 = ZEXT3264(local_7e0);
            auVar257 = ZEXT3264(local_800);
            auVar258 = ZEXT3264(local_820);
            auVar259 = ZEXT3264(local_840);
            auVar260 = ZEXT3264(local_860);
            auVar261 = ZEXT3264(local_880);
            auVar262 = ZEXT3264(local_8a0);
            auVar264 = ZEXT3264(local_8c0);
            auVar266 = ZEXT3264(local_8e0);
            auVar267 = ZEXT3264(local_740);
            auVar268 = ZEXT3264(local_760);
            auVar269 = ZEXT3264(local_7c0);
            auVar270 = ZEXT3264(local_900);
            auVar86 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                      local_920._0_16_);
            auVar94 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      local_7a0._0_16_);
            auVar93 = vshufps_avx(_local_520,_local_520,0x55);
            auVar185._0_4_ = auVar93._0_4_ * (float)local_5c0._0_4_;
            auVar185._4_4_ = auVar93._4_4_ * (float)local_5c0._4_4_;
            auVar185._8_4_ = auVar93._8_4_ * fStack_5b8;
            auVar185._12_4_ = auVar93._12_4_ * fStack_5b4;
            auVar205._0_4_ = auVar94._0_4_;
            auVar205._4_4_ = auVar205._0_4_;
            auVar205._8_4_ = auVar205._0_4_;
            auVar205._12_4_ = auVar205._0_4_;
            auVar93 = vfmadd132ps_fma(auVar205,auVar185,local_580._0_16_);
            auVar169._0_4_ = auVar86._0_4_;
            auVar169._4_4_ = auVar169._0_4_;
            auVar169._8_4_ = auVar169._0_4_;
            auVar169._12_4_ = auVar169._0_4_;
            auVar93 = vfmadd132ps_fma(auVar169,auVar93,local_5a0._0_16_);
            auVar93 = vfmadd132ps_fma(_local_540,auVar93,local_560._0_16_);
            auVar170._0_4_ = auVar93._0_4_ * (float)local_460._0_4_;
            auVar170._4_4_ = auVar93._4_4_ * (float)local_460._0_4_;
            auVar170._8_4_ = auVar93._8_4_ * (float)local_460._0_4_;
            auVar170._12_4_ = auVar93._12_4_ * (float)local_460._0_4_;
            auVar93 = vdpps_avx(auVar88,auVar93,0x7f);
            fVar181 = auVar93._0_4_;
            auVar186._0_4_ = auVar88._0_4_ * fVar181;
            auVar186._4_4_ = auVar88._4_4_ * fVar181;
            auVar186._8_4_ = auVar88._8_4_ * fVar181;
            auVar186._12_4_ = auVar88._12_4_ * fVar181;
            auVar93 = vsubps_avx(auVar170,auVar186);
            fVar181 = (float)local_490._0_4_ * (float)local_480._0_4_;
            auVar86 = vmaxss_avx(ZEXT416((uint)local_650),
                                 ZEXT416((uint)(local_520._0_4_ * fVar202 * 1.9073486e-06)));
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar90 = vxorps_avx512vl(auVar88,auVar20);
            auVar187._0_4_ = fVar142 * auVar93._0_4_ * fVar181;
            auVar187._4_4_ = fVar221 * auVar93._4_4_ * fVar181;
            auVar187._8_4_ = fVar164 * auVar93._8_4_ * fVar181;
            auVar187._12_4_ = fVar179 * auVar93._12_4_ * fVar181;
            auVar93 = vdpps_avx(auVar90,local_640,0x7f);
            auVar94 = vfmadd213ss_fma(auVar87,ZEXT416((uint)local_650),auVar86);
            auVar87 = vdpps_avx(local_700._0_16_,auVar187,0x7f);
            auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar245 + 1.0)),
                                      ZEXT416((uint)(local_650 / fVar244)),auVar94);
            fVar142 = auVar93._0_4_ + auVar87._0_4_;
            auVar87 = vdpps_avx(local_500._0_16_,local_640,0x7f);
            auVar93 = vdpps_avx(local_700._0_16_,auVar90,0x7f);
            fVar244 = auVar85._0_4_;
            auVar91 = vaddss_avx512f(auVar89,ZEXT416((uint)(fVar244 * fVar243 * -0.5 *
                                                           fVar244 * fVar244)));
            auVar85 = vdpps_avx(local_700._0_16_,local_500._0_16_,0x7f);
            auVar90 = vfnmadd231ss_fma(auVar93,auVar92,ZEXT416((uint)fVar142));
            auVar85 = vfnmadd231ss_fma(auVar85,auVar92,auVar87);
            auVar93 = vpermilps_avx(local_440._0_16_,0xff);
            fVar220 = fVar220 - auVar93._0_4_;
            auVar89 = vshufps_avx(auVar88,auVar88,0xff);
            auVar93 = vfmsub213ss_fma(auVar90,auVar91,auVar89);
            auVar240._8_4_ = 0x80000000;
            auVar240._0_8_ = 0x8000000080000000;
            auVar240._12_4_ = 0x80000000;
            auVar242 = ZEXT1664(auVar240);
            auVar234._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
            auVar234._8_4_ = auVar93._8_4_ ^ 0x80000000;
            auVar234._12_4_ = auVar93._12_4_ ^ 0x80000000;
            auVar238 = ZEXT1664(auVar234);
            auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar91._0_4_));
            auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar93._0_4_)),
                                      ZEXT416((uint)fVar142),auVar85);
            auVar93 = vinsertps_avx(auVar234,auVar85,0x1c);
            auVar228._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
            auVar228._8_4_ = auVar87._8_4_ ^ 0x80000000;
            auVar228._12_4_ = auVar87._12_4_ ^ 0x80000000;
            auVar85 = vinsertps_avx(ZEXT416((uint)fVar142),auVar228,0x10);
            auVar206._0_4_ = auVar90._0_4_;
            auVar206._4_4_ = auVar206._0_4_;
            auVar206._8_4_ = auVar206._0_4_;
            auVar206._12_4_ = auVar206._0_4_;
            auVar87 = vdivps_avx(auVar93,auVar206);
            auVar93 = vdivps_avx(auVar85,auVar206);
            fVar142 = auVar92._0_4_;
            auVar231 = ZEXT1664(CONCAT412(fVar220,CONCAT48(fVar220,CONCAT44(fVar220,fVar220))));
            auVar207._0_4_ = fVar142 * auVar87._0_4_ + fVar220 * auVar93._0_4_;
            auVar207._4_4_ = fVar142 * auVar87._4_4_ + fVar220 * auVar93._4_4_;
            auVar207._8_4_ = fVar142 * auVar87._8_4_ + fVar220 * auVar93._8_4_;
            auVar207._12_4_ = fVar142 * auVar87._12_4_ + fVar220 * auVar93._12_4_;
            auVar87 = vsubps_avx(_local_520,auVar207);
            auVar246 = ZEXT1664(auVar87);
            auVar21._8_4_ = 0x7fffffff;
            auVar21._0_8_ = 0x7fffffff7fffffff;
            auVar21._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx512vl(auVar92,auVar21);
            if (auVar92._0_4_ < auVar94._0_4_) {
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar86._0_4_)),local_4d0,
                                        ZEXT416(0x36000000));
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar93 = vandps_avx512vl(ZEXT416((uint)fVar220),auVar22);
              if (auVar93._0_4_ < auVar92._0_4_) {
                bVar82 = uVar77 < 5;
                fVar202 = auVar87._0_4_ + (float)local_4e0._0_4_;
                bVar75 = 0;
                if ((fVar202 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar202))
                goto LAB_019d1f37;
                auVar92 = vmovshdup_avx(auVar87);
                fVar142 = auVar92._0_4_;
                bVar75 = 0;
                if ((fVar142 < 0.0) || (bVar75 = 0, 1.0 < fVar142)) goto LAB_019d1f37;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                fVar244 = auVar92._0_4_;
                fVar243 = local_5e0._0_4_ * -0.5;
                auVar231 = ZEXT464((uint)fVar243);
                pGVar3 = (local_938->scene->geometries).items[local_928].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((local_938->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar75 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_019d1f37;
                  local_920._0_4_ = ray->tfar;
                  fVar243 = fVar244 * 1.5 + fVar243 * fVar244 * fVar244 * fVar244;
                  auVar208._0_4_ = local_700._0_4_ * fVar243;
                  auVar208._4_4_ = local_700._4_4_ * fVar243;
                  auVar208._8_4_ = local_700._8_4_ * fVar243;
                  auVar208._12_4_ = local_700._12_4_ * fVar243;
                  auVar89 = vfmadd213ps_fma(auVar89,auVar208,auVar88);
                  auVar92 = vshufps_avx(auVar208,auVar208,0xc9);
                  auVar93 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar209._0_4_ = auVar208._0_4_ * auVar93._0_4_;
                  auVar209._4_4_ = auVar208._4_4_ * auVar93._4_4_;
                  auVar209._8_4_ = auVar208._8_4_ * auVar93._8_4_;
                  auVar209._12_4_ = auVar208._12_4_ * auVar93._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar209,auVar88,auVar92);
                  auVar92 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar93 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar231 = ZEXT1664(auVar93);
                  auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                  auVar149._0_4_ = auVar89._0_4_ * auVar85._0_4_;
                  auVar149._4_4_ = auVar89._4_4_ * auVar85._4_4_;
                  auVar149._8_4_ = auVar89._8_4_ * auVar85._8_4_;
                  auVar149._12_4_ = auVar89._12_4_ * auVar85._12_4_;
                  auVar85 = vfmsub231ps_fma(auVar149,auVar92,auVar93);
                  auVar92 = vshufps_avx(auVar85,auVar85,0xe9);
                  local_630 = vmovlps_avx(auVar92);
                  local_628 = auVar85._0_4_;
                  local_620 = 0;
                  local_61c = local_92c;
                  local_618 = (undefined4)local_928;
                  local_614 = local_938->user->instID[0];
                  local_610 = local_938->user->instPrimID[0];
                  ray->tfar = fVar202;
                  local_93c = -1;
                  local_6d0.valid = &local_93c;
                  local_6d0.geometryUserPtr = pGVar3->userPtr;
                  local_6d0.context = local_938->user;
                  local_6d0.hit = (RTCHitN *)&local_630;
                  local_6d0.N = 1;
                  local_7a0._0_8_ = pGVar3;
                  local_6d0.ray = (RTCRayN *)ray;
                  local_624 = fVar142;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019d21a5:
                    p_Var4 = local_938->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((local_938->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var4)(&local_6d0);
                      auVar270 = ZEXT3264(local_900);
                      auVar269 = ZEXT3264(local_7c0);
                      auVar268 = ZEXT3264(local_760);
                      auVar267 = ZEXT3264(local_740);
                      auVar266 = ZEXT3264(local_8e0);
                      auVar264 = ZEXT3264(local_8c0);
                      auVar262 = ZEXT3264(local_8a0);
                      auVar261 = ZEXT3264(local_880);
                      auVar260 = ZEXT3264(local_860);
                      auVar259 = ZEXT3264(local_840);
                      auVar258 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_800);
                      auVar263 = ZEXT3264(local_7e0);
                      auVar265 = ZEXT3264(local_720);
                      if (*local_6d0.valid == 0) goto LAB_019d2263;
                    }
                    bVar75 = 1;
                    goto LAB_019d1f37;
                  }
                  auVar231 = ZEXT1664(auVar93);
                  auVar238 = ZEXT1664(auVar234);
                  auVar242 = ZEXT1664(auVar240);
                  auVar246 = ZEXT1664(auVar87);
                  auVar249 = ZEXT1664(local_700._0_16_);
                  auVar254 = ZEXT1664(auVar88);
                  (*pGVar3->occlusionFilterN)(&local_6d0);
                  auVar270 = ZEXT3264(local_900);
                  auVar269 = ZEXT3264(local_7c0);
                  auVar268 = ZEXT3264(local_760);
                  auVar267 = ZEXT3264(local_740);
                  auVar266 = ZEXT3264(local_8e0);
                  auVar264 = ZEXT3264(local_8c0);
                  auVar262 = ZEXT3264(local_8a0);
                  auVar261 = ZEXT3264(local_880);
                  auVar260 = ZEXT3264(local_860);
                  auVar259 = ZEXT3264(local_840);
                  auVar258 = ZEXT3264(local_820);
                  auVar257 = ZEXT3264(local_800);
                  auVar263 = ZEXT3264(local_7e0);
                  auVar265 = ZEXT3264(local_720);
                  if (*local_6d0.valid != 0) goto LAB_019d21a5;
LAB_019d2263:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar75 = 0;
                goto LAB_019d1f37;
              }
            }
            uVar77 = uVar77 + 1;
          }
          bVar82 = false;
LAB_019d1f37:
          bVar78 = bVar78 | bVar82 & bVar75;
          auVar72._4_4_ = fStack_37c;
          auVar72._0_4_ = local_380;
          auVar72._8_4_ = fStack_378;
          auVar72._12_4_ = fStack_374;
          auVar72._16_4_ = fStack_370;
          auVar72._20_4_ = fStack_36c;
          auVar72._24_4_ = fStack_368;
          auVar72._28_4_ = fStack_364;
          fVar202 = ray->tfar;
          auVar34._4_4_ = fVar202;
          auVar34._0_4_ = fVar202;
          auVar34._8_4_ = fVar202;
          auVar34._12_4_ = fVar202;
          auVar34._16_4_ = fVar202;
          auVar34._20_4_ = fVar202;
          auVar34._24_4_ = fVar202;
          auVar34._28_4_ = fVar202;
          uVar15 = vcmpps_avx512vl(auVar72,auVar34,2);
        }
        auVar177._0_4_ = (float)local_3e0._0_4_ + (float)local_3c0._0_4_;
        auVar177._4_4_ = (float)local_3e0._4_4_ + (float)local_3c0._4_4_;
        auVar177._8_4_ = fStack_3d8 + fStack_3b8;
        auVar177._12_4_ = fStack_3d4 + fStack_3b4;
        auVar177._16_4_ = fStack_3d0 + fStack_3b0;
        auVar177._20_4_ = fStack_3cc + fStack_3ac;
        auVar177._24_4_ = fStack_3c8 + fStack_3a8;
        auVar177._28_4_ = fStack_3c4 + fStack_3a4;
        fVar142 = ray->tfar;
        fVar202 = ray->tfar;
        auVar35._4_4_ = fVar202;
        auVar35._0_4_ = fVar202;
        auVar35._8_4_ = fVar202;
        auVar35._12_4_ = fVar202;
        auVar35._16_4_ = fVar202;
        auVar35._20_4_ = fVar202;
        auVar35._24_4_ = fVar202;
        auVar35._28_4_ = fVar202;
        uVar15 = vcmpps_avx512vl(auVar177,auVar35,2);
        auVar178._8_4_ = 2;
        auVar178._0_8_ = 0x200000002;
        auVar178._12_4_ = 2;
        auVar178._16_4_ = 2;
        auVar178._20_4_ = 2;
        auVar178._24_4_ = 2;
        auVar178._28_4_ = 2;
        auVar36._8_4_ = 3;
        auVar36._0_8_ = 0x300000003;
        auVar36._12_4_ = 3;
        auVar36._16_4_ = 3;
        auVar36._20_4_ = 3;
        auVar36._24_4_ = 3;
        auVar36._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar178,auVar36);
        bVar82 = (bool)((byte)local_768 & 1);
        local_3c0._0_4_ = (uint)bVar82 * auVar99._0_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)((byte)(local_768 >> 1) & 1);
        local_3c0._4_4_ = (uint)bVar82 * auVar99._4_4_ | (uint)!bVar82 * 2;
        bVar82 = (bool)((byte)(local_768 >> 2) & 1);
        fStack_3b8 = (float)((uint)bVar82 * auVar99._8_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)((byte)(local_768 >> 3) & 1);
        fStack_3b4 = (float)((uint)bVar82 * auVar99._12_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)((byte)(local_768 >> 4) & 1);
        fStack_3b0 = (float)((uint)bVar82 * auVar99._16_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)((byte)(local_768 >> 5) & 1);
        fStack_3ac = (float)((uint)bVar82 * auVar99._20_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)((byte)(local_768 >> 6) & 1);
        fStack_3a8 = (float)((uint)bVar82 * auVar99._24_4_ | (uint)!bVar82 * 2);
        bVar82 = (bool)((byte)(local_768 >> 7) & 1);
        fStack_3a4 = (float)((uint)bVar82 * auVar99._28_4_ | (uint)!bVar82 * 2);
        bVar74 = (byte)uVar16 & bVar74 & (byte)uVar15;
        uVar15 = vpcmpd_avx512vl(_local_3c0,local_340,2);
        local_400 = _local_320;
        local_380 = (float)local_3e0._0_4_ + (float)local_320._0_4_;
        fStack_37c = (float)local_3e0._4_4_ + (float)local_320._4_4_;
        fStack_378 = fStack_3d8 + fStack_318;
        fStack_374 = fStack_3d4 + fStack_314;
        fStack_370 = fStack_3d0 + fStack_310;
        fStack_36c = fStack_3cc + fStack_30c;
        fStack_368 = fStack_3c8 + fStack_308;
        fStack_364 = fStack_3c4 + fStack_304;
        auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        for (bVar79 = (byte)uVar15 & bVar74; auVar99 = local_920, bVar79 != 0;
            bVar79 = ~bVar80 & bVar79 & (byte)uVar15) {
          auVar158._8_4_ = 0x7f800000;
          auVar158._0_8_ = 0x7f8000007f800000;
          auVar158._12_4_ = 0x7f800000;
          auVar158._16_4_ = 0x7f800000;
          auVar158._20_4_ = 0x7f800000;
          auVar158._24_4_ = 0x7f800000;
          auVar158._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar158,local_400);
          auVar134._0_4_ =
               (uint)(bVar79 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          auVar134._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 2 & 1);
          auVar134._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 3 & 1);
          auVar134._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 4 & 1);
          auVar134._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 5 & 1);
          auVar134._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * 0x7f800000;
          bVar82 = (bool)(bVar79 >> 6 & 1);
          auVar134._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * 0x7f800000;
          auVar134._28_4_ =
               (uint)(bVar79 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
          auVar98 = vshufps_avx(auVar134,auVar134,0xb1);
          auVar98 = vminps_avx(auVar134,auVar98);
          auVar101 = vshufpd_avx(auVar98,auVar98,5);
          auVar98 = vminps_avx(auVar98,auVar101);
          auVar101 = vpermpd_avx2(auVar98,0x4e);
          auVar98 = vminps_avx(auVar98,auVar101);
          uVar15 = vcmpps_avx512vl(auVar134,auVar98,0);
          bVar75 = (byte)uVar15 & bVar79;
          bVar80 = bVar79;
          if (bVar75 != 0) {
            bVar80 = bVar75;
          }
          iVar18 = 0;
          for (uVar84 = (uint)bVar80; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
            iVar18 = iVar18 + 1;
          }
          bVar80 = '\x01' << ((byte)iVar18 & 0x1f);
          auVar238 = ZEXT464(*(uint *)(local_300 + (uint)(iVar18 << 2)));
          aVar1 = (ray->dir).field_0;
          local_500._0_16_ = (undefined1  [16])aVar1;
          auVar87 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
          if (auVar87._0_4_ < 0.0) {
            local_920[1] = 0;
            local_920[0] = bVar79;
            local_920._2_30_ = auVar99._2_30_;
            local_7a0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
            local_700._0_16_ = ZEXT416(*(uint *)(local_300 + (uint)(iVar18 << 2)));
            auVar242 = ZEXT1664(auVar242._0_16_);
            auVar249 = ZEXT1664(auVar249._0_16_);
            auVar254 = ZEXT1664(auVar254._0_16_);
            fVar202 = sqrtf(auVar87._0_4_);
            auVar238 = ZEXT1664(local_700._0_16_);
            bVar79 = local_920[0];
            auVar270 = ZEXT3264(local_900);
            auVar269 = ZEXT3264(local_7c0);
            auVar268 = ZEXT3264(local_760);
            auVar267 = ZEXT3264(local_740);
            auVar266 = ZEXT3264(local_8e0);
            auVar264 = ZEXT3264(local_8c0);
            auVar262 = ZEXT3264(local_8a0);
            auVar261 = ZEXT3264(local_880);
            auVar260 = ZEXT3264(local_860);
            auVar259 = ZEXT3264(local_840);
            auVar258 = ZEXT3264(local_820);
            auVar257 = ZEXT3264(local_800);
            auVar263 = ZEXT3264(local_7e0);
            auVar265 = ZEXT3264(local_720);
            auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar87 = local_7a0._0_16_;
          }
          else {
            auVar87 = vsqrtss_avx(auVar87,auVar87);
            fVar202 = auVar87._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar18 << 2)));
          }
          uVar83 = (ulong)bVar80;
          auVar92 = vminps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar88 = vmaxps_avx(local_560._0_16_,local_5a0._0_16_);
          auVar231 = ZEXT3264(_local_5c0);
          auVar93 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar85 = vminps_avx(auVar92,auVar93);
          auVar92 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar93 = vmaxps_avx(auVar88,auVar92);
          auVar210._8_4_ = 0x7fffffff;
          auVar210._0_8_ = 0x7fffffff7fffffff;
          auVar210._12_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar85,auVar210);
          auVar92 = vandps_avx(auVar93,auVar210);
          auVar88 = vmaxps_avx(auVar88,auVar92);
          auVar92 = vmovshdup_avx(auVar88);
          auVar92 = vmaxss_avx(auVar92,auVar88);
          auVar88 = vshufpd_avx(auVar88,auVar88,1);
          auVar88 = vmaxss_avx(auVar88,auVar92);
          fVar142 = auVar88._0_4_ * 1.9073486e-06;
          local_4d0 = vshufps_avx(auVar93,auVar93,0xff);
          auVar87 = vinsertps_avx(auVar238._0_16_,auVar87,0x10);
          auVar246 = ZEXT1664(auVar87);
          uVar77 = 0;
          while( true ) {
            bVar75 = (byte)uVar83;
            if (uVar77 == 5) break;
            uVar144 = auVar246._0_4_;
            auVar150._4_4_ = uVar144;
            auVar150._0_4_ = uVar144;
            auVar150._8_4_ = uVar144;
            auVar150._12_4_ = uVar144;
            auVar88 = vfmadd132ps_fma(auVar150,ZEXT816(0) << 0x40,local_500._0_16_);
            _local_520 = auVar246._0_16_;
            auVar87 = vmovshdup_avx(auVar246._0_16_);
            fVar221 = auVar87._0_4_;
            fVar220 = 1.0 - fVar221;
            fVar245 = fVar220 * fVar220 * fVar220;
            fVar243 = fVar221 * fVar221;
            fVar164 = fVar243 * fVar221;
            auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar245),
                                      ZEXT416((uint)fVar164));
            fVar244 = fVar221 * fVar220;
            local_7a0._0_16_ = ZEXT416((uint)fVar220);
            local_920._0_16_ = auVar87;
            auVar93 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar221 * 6.0)),
                                      ZEXT416((uint)(fVar244 * fVar220)),
                                      SUB6416(ZEXT464(0x41400000),0));
            auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar164),
                                      ZEXT416((uint)fVar245));
            auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar220 * 6.0)),
                                      SUB6416(ZEXT464(0x41400000),0),
                                      ZEXT416((uint)(fVar244 * fVar221)));
            fVar245 = fVar245 * 0.16666667;
            fVar220 = (auVar92._0_4_ + auVar93._0_4_) * 0.16666667;
            fVar221 = (auVar87._0_4_ + auVar85._0_4_) * 0.16666667;
            fVar164 = fVar164 * 0.16666667;
            auVar188._0_4_ = fVar164 * (float)local_5c0._0_4_;
            auVar188._4_4_ = fVar164 * (float)local_5c0._4_4_;
            auVar188._8_4_ = fVar164 * fStack_5b8;
            auVar188._12_4_ = fVar164 * fStack_5b4;
            auVar223._4_4_ = fVar221;
            auVar223._0_4_ = fVar221;
            auVar223._8_4_ = fVar221;
            auVar223._12_4_ = fVar221;
            auVar87 = vfmadd132ps_fma(auVar223,auVar188,local_580._0_16_);
            auVar189._4_4_ = fVar220;
            auVar189._0_4_ = fVar220;
            auVar189._8_4_ = fVar220;
            auVar189._12_4_ = fVar220;
            auVar87 = vfmadd132ps_fma(auVar189,auVar87,local_5a0._0_16_);
            auVar171._4_4_ = fVar245;
            auVar171._0_4_ = fVar245;
            auVar171._8_4_ = fVar245;
            auVar171._12_4_ = fVar245;
            auVar87 = vfmadd132ps_fma(auVar171,auVar87,local_560._0_16_);
            local_440._0_16_ = auVar87;
            auVar87 = vsubps_avx(auVar88,auVar87);
            local_700._0_16_ = auVar87;
            auVar87 = vdpps_avx(auVar87,auVar87,0x7f);
            local_5e0._0_16_ = auVar87;
            if (auVar87._0_4_ < 0.0) {
              local_680._0_4_ = fVar243;
              local_6a0._0_4_ = fVar244;
              auVar231._0_4_ = sqrtf(auVar87._0_4_);
              auVar231._4_60_ = extraout_var_00;
              auVar87 = auVar231._0_16_;
              uVar83 = extraout_RAX_02;
              fVar244 = (float)local_6a0._0_4_;
            }
            else {
              auVar87 = vsqrtss_avx(auVar87,auVar87);
              local_680._0_4_ = fVar243;
            }
            local_460._4_4_ = local_7a0._0_4_;
            local_460._0_4_ = local_460._4_4_;
            fStack_458 = (float)local_460._4_4_;
            fStack_454 = (float)local_460._4_4_;
            auVar92 = vfnmsub213ss_fma(local_920._0_16_,local_920._0_16_,
                                       ZEXT416((uint)(fVar244 * 4.0)));
            auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * 4.0)),local_7a0._0_16_,
                                      local_7a0._0_16_);
            fVar243 = (float)local_460._4_4_ * -(float)local_460._4_4_ * 0.5;
            fVar244 = auVar92._0_4_ * 0.5;
            fVar245 = auVar88._0_4_ * 0.5;
            local_680._0_4_ = (float)local_680._0_4_ * 0.5;
            auVar211._0_4_ = (float)local_680._0_4_ * (float)local_5c0._0_4_;
            auVar211._4_4_ = (float)local_680._0_4_ * (float)local_5c0._4_4_;
            auVar211._8_4_ = (float)local_680._0_4_ * fStack_5b8;
            auVar211._12_4_ = (float)local_680._0_4_ * fStack_5b4;
            auVar172._4_4_ = fVar245;
            auVar172._0_4_ = fVar245;
            auVar172._8_4_ = fVar245;
            auVar172._12_4_ = fVar245;
            auVar88 = vfmadd132ps_fma(auVar172,auVar211,local_580._0_16_);
            auVar190._4_4_ = fVar244;
            auVar190._0_4_ = fVar244;
            auVar190._8_4_ = fVar244;
            auVar190._12_4_ = fVar244;
            auVar88 = vfmadd132ps_fma(auVar190,auVar88,local_5a0._0_16_);
            auVar255._4_4_ = fVar243;
            auVar255._0_4_ = fVar243;
            auVar255._8_4_ = fVar243;
            auVar255._12_4_ = fVar243;
            local_680._0_16_ = vfmadd132ps_fma(auVar255,auVar88,local_560._0_16_);
            local_480._0_16_ = vdpps_avx(local_680._0_16_,local_680._0_16_,0x7f);
            auVar68._12_4_ = 0;
            auVar68._0_12_ = ZEXT812(0);
            fVar243 = local_480._0_4_;
            _local_540 = vrsqrt14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar243));
            fVar244 = local_540._0_4_;
            local_650 = fVar243 * -0.5;
            local_490 = vrcp14ss_avx512f(auVar68 << 0x20,ZEXT416((uint)fVar243));
            auVar88 = vfnmadd213ss_fma(local_490,local_480._0_16_,ZEXT416(0x40000000));
            local_640._0_4_ = auVar88._0_4_;
            local_6a0._0_4_ = auVar87._0_4_;
            if (fVar243 < -fVar243) {
              fVar243 = sqrtf(fVar243);
              auVar87 = ZEXT416((uint)local_6a0._0_4_);
              uVar83 = extraout_RAX_03;
              auVar88 = local_680._0_16_;
            }
            else {
              auVar88 = vsqrtss_avx(local_480._0_16_,local_480._0_16_);
              fVar243 = auVar88._0_4_;
              auVar88 = local_680._0_16_;
            }
            fVar245 = local_540._0_4_;
            local_650 = fVar244 * 1.5 + local_650 * fVar245 * fVar245 * fVar245;
            auVar256._0_4_ = auVar88._0_4_ * local_650;
            auVar256._4_4_ = auVar88._4_4_ * local_650;
            auVar256._8_4_ = auVar88._8_4_ * local_650;
            auVar256._12_4_ = auVar88._12_4_ * local_650;
            _local_540 = vdpps_avx(local_700._0_16_,auVar256,0x7f);
            fVar244 = auVar87._0_4_ + 1.0;
            auVar151._0_4_ = local_540._0_4_ * local_540._0_4_;
            auVar151._4_4_ = local_540._4_4_ * local_540._4_4_;
            auVar151._8_4_ = local_540._8_4_ * local_540._8_4_;
            auVar151._12_4_ = local_540._12_4_ * local_540._12_4_;
            auVar92 = vsubps_avx(local_5e0._0_16_,auVar151);
            fVar245 = auVar92._0_4_;
            auVar173._4_12_ = ZEXT812(0) << 0x20;
            auVar173._0_4_ = fVar245;
            auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
            auVar85 = vmulss_avx512f(auVar93,ZEXT416(0x3fc00000));
            fStack_64c = local_650;
            fStack_648 = local_650;
            fStack_644 = local_650;
            if (fVar245 < 0.0) {
              local_4a0._0_4_ = fVar244;
              _local_4c0 = auVar256;
              local_4b0 = auVar93;
              fVar220 = sqrtf(fVar245);
              auVar85 = ZEXT416(auVar85._0_4_);
              auVar87 = ZEXT416((uint)local_6a0._0_4_);
              uVar83 = extraout_RAX_04;
              auVar93 = local_4b0;
              auVar88 = local_680._0_16_;
              fVar244 = (float)local_4a0._0_4_;
              auVar256 = _local_4c0;
            }
            else {
              auVar92 = vsqrtss_avx(auVar92,auVar92);
              fVar220 = auVar92._0_4_;
            }
            auVar254 = ZEXT1664(local_5e0._0_16_);
            auVar249 = ZEXT1664(local_700._0_16_);
            auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
            auVar265 = ZEXT3264(local_720);
            auVar263 = ZEXT3264(local_7e0);
            auVar257 = ZEXT3264(local_800);
            auVar258 = ZEXT3264(local_820);
            auVar259 = ZEXT3264(local_840);
            auVar260 = ZEXT3264(local_860);
            auVar261 = ZEXT3264(local_880);
            auVar262 = ZEXT3264(local_8a0);
            auVar264 = ZEXT3264(local_8c0);
            auVar266 = ZEXT3264(local_8e0);
            auVar267 = ZEXT3264(local_740);
            auVar268 = ZEXT3264(local_760);
            auVar269 = ZEXT3264(local_7c0);
            auVar270 = ZEXT3264(local_900);
            auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,
                                      local_920._0_16_);
            auVar86 = vfmadd213ss_fma(local_920._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                      local_7a0._0_16_);
            auVar92 = vshufps_avx(_local_520,_local_520,0x55);
            auVar191._0_4_ = auVar92._0_4_ * (float)local_5c0._0_4_;
            auVar191._4_4_ = auVar92._4_4_ * (float)local_5c0._4_4_;
            auVar191._8_4_ = auVar92._8_4_ * fStack_5b8;
            auVar191._12_4_ = auVar92._12_4_ * fStack_5b4;
            auVar212._0_4_ = auVar86._0_4_;
            auVar212._4_4_ = auVar212._0_4_;
            auVar212._8_4_ = auVar212._0_4_;
            auVar212._12_4_ = auVar212._0_4_;
            auVar92 = vfmadd132ps_fma(auVar212,auVar191,local_580._0_16_);
            auVar174._0_4_ = auVar89._0_4_;
            auVar174._4_4_ = auVar174._0_4_;
            auVar174._8_4_ = auVar174._0_4_;
            auVar174._12_4_ = auVar174._0_4_;
            auVar92 = vfmadd132ps_fma(auVar174,auVar92,local_5a0._0_16_);
            auVar92 = vfmadd132ps_fma(_local_460,auVar92,local_560._0_16_);
            auVar175._0_4_ = auVar92._0_4_ * (float)local_480._0_4_;
            auVar175._4_4_ = auVar92._4_4_ * (float)local_480._0_4_;
            auVar175._8_4_ = auVar92._8_4_ * (float)local_480._0_4_;
            auVar175._12_4_ = auVar92._12_4_ * (float)local_480._0_4_;
            auVar92 = vdpps_avx(auVar88,auVar92,0x7f);
            fVar221 = auVar92._0_4_;
            auVar192._0_4_ = auVar88._0_4_ * fVar221;
            auVar192._4_4_ = auVar88._4_4_ * fVar221;
            auVar192._8_4_ = auVar88._8_4_ * fVar221;
            auVar192._12_4_ = auVar88._12_4_ * fVar221;
            auVar92 = vsubps_avx(auVar175,auVar192);
            fVar221 = (float)local_640._0_4_ * (float)local_490._0_4_;
            auVar89 = vmaxss_avx(ZEXT416((uint)fVar142),
                                 ZEXT416((uint)(local_520._0_4_ * fVar202 * 1.9073486e-06)));
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar94 = vxorps_avx512vl(auVar88,auVar23);
            auVar193._0_4_ = auVar92._0_4_ * fVar221 * local_650;
            auVar193._4_4_ = auVar92._4_4_ * fVar221 * fStack_64c;
            auVar193._8_4_ = auVar92._8_4_ * fVar221 * fStack_648;
            auVar193._12_4_ = auVar92._12_4_ * fVar221 * fStack_644;
            auVar92 = vdpps_avx(auVar94,auVar256,0x7f);
            auVar86 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar142),auVar89);
            auVar87 = vdpps_avx(local_700._0_16_,auVar193,0x7f);
            auVar86 = vfmadd213ss_fma(ZEXT416((uint)fVar244),ZEXT416((uint)(fVar142 / fVar243)),
                                      auVar86);
            fVar243 = auVar92._0_4_ + auVar87._0_4_;
            auVar87 = vdpps_avx(local_500._0_16_,auVar256,0x7f);
            auVar92 = vdpps_avx(local_700._0_16_,auVar94,0x7f);
            fVar244 = auVar93._0_4_;
            auVar94 = vaddss_avx512f(auVar85,ZEXT416((uint)(fVar244 * fVar245 * -0.5 *
                                                           fVar244 * fVar244)));
            auVar93 = vdpps_avx(local_700._0_16_,local_500._0_16_,0x7f);
            auVar90 = vfnmadd231ss_avx512f(auVar92,_local_540,ZEXT416((uint)fVar243));
            auVar93 = vfnmadd231ss_avx512f(auVar93,_local_540,auVar87);
            auVar92 = vpermilps_avx(local_440._0_16_,0xff);
            fVar220 = fVar220 - auVar92._0_4_;
            auVar85 = vshufps_avx(auVar88,auVar88,0xff);
            auVar92 = vfmsub213ss_fma(auVar90,auVar94,auVar85);
            auVar241._8_4_ = 0x80000000;
            auVar241._0_8_ = 0x8000000080000000;
            auVar241._12_4_ = 0x80000000;
            auVar242 = ZEXT1664(auVar241);
            auVar235._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar235._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar235._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar238 = ZEXT1664(auVar235);
            auVar93 = ZEXT416((uint)(auVar93._0_4_ * auVar94._0_4_));
            auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar92._0_4_)),
                                      ZEXT416((uint)fVar243),auVar93);
            auVar92 = vinsertps_avx(auVar235,auVar93,0x1c);
            auVar229._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
            auVar229._8_4_ = auVar87._8_4_ ^ 0x80000000;
            auVar229._12_4_ = auVar87._12_4_ ^ 0x80000000;
            auVar93 = vinsertps_avx(ZEXT416((uint)fVar243),auVar229,0x10);
            auVar213._0_4_ = auVar94._0_4_;
            auVar213._4_4_ = auVar213._0_4_;
            auVar213._8_4_ = auVar213._0_4_;
            auVar213._12_4_ = auVar213._0_4_;
            auVar87 = vdivps_avx(auVar92,auVar213);
            auVar92 = vdivps_avx(auVar93,auVar213);
            auVar93 = vbroadcastss_avx512vl(_local_540);
            auVar231 = ZEXT1664(CONCAT412(fVar220,CONCAT48(fVar220,CONCAT44(fVar220,fVar220))));
            auVar214._0_4_ = auVar93._0_4_ * auVar87._0_4_ + fVar220 * auVar92._0_4_;
            auVar214._4_4_ = auVar93._4_4_ * auVar87._4_4_ + fVar220 * auVar92._4_4_;
            auVar214._8_4_ = auVar93._8_4_ * auVar87._8_4_ + fVar220 * auVar92._8_4_;
            auVar214._12_4_ = auVar93._12_4_ * auVar87._12_4_ + fVar220 * auVar92._12_4_;
            auVar87 = vsubps_avx(_local_520,auVar214);
            auVar246 = ZEXT1664(auVar87);
            auVar24._8_4_ = 0x7fffffff;
            auVar24._0_8_ = 0x7fffffff7fffffff;
            auVar24._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx512vl(_local_540,auVar24);
            if (auVar92._0_4_ < auVar86._0_4_) {
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar89._0_4_)),local_4d0,
                                        ZEXT416(0x36000000));
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar93 = vandps_avx512vl(ZEXT416((uint)fVar220),auVar25);
              if (auVar93._0_4_ < auVar92._0_4_) {
                bVar82 = uVar77 < 5;
                fVar202 = auVar87._0_4_ + (float)local_4e0._0_4_;
                bVar75 = 0;
                if ((fVar202 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar202))
                goto LAB_019d2afe;
                auVar92 = vmovshdup_avx(auVar87);
                fVar142 = auVar92._0_4_;
                bVar75 = 0;
                if ((fVar142 < 0.0) || (bVar75 = 0, 1.0 < fVar142)) goto LAB_019d2afe;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_5e0._0_4_));
                fVar244 = auVar92._0_4_;
                fVar243 = local_5e0._0_4_ * -0.5;
                auVar231 = ZEXT464((uint)fVar243);
                pGVar3 = (local_938->scene->geometries).items[local_928].ptr;
                if ((pGVar3->mask & ray->mask) != 0) {
                  if ((local_938->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar75 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_019d2afe;
                  local_920._0_4_ = ray->tfar;
                  fVar243 = fVar244 * 1.5 + fVar243 * fVar244 * fVar244 * fVar244;
                  auVar215._0_4_ = local_700._0_4_ * fVar243;
                  auVar215._4_4_ = local_700._4_4_ * fVar243;
                  auVar215._8_4_ = local_700._8_4_ * fVar243;
                  auVar215._12_4_ = local_700._12_4_ * fVar243;
                  auVar85 = vfmadd213ps_fma(auVar85,auVar215,auVar88);
                  auVar92 = vshufps_avx(auVar215,auVar215,0xc9);
                  auVar93 = vshufps_avx(auVar88,auVar88,0xc9);
                  auVar216._0_4_ = auVar215._0_4_ * auVar93._0_4_;
                  auVar216._4_4_ = auVar215._4_4_ * auVar93._4_4_;
                  auVar216._8_4_ = auVar215._8_4_ * auVar93._8_4_;
                  auVar216._12_4_ = auVar215._12_4_ * auVar93._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar216,auVar88,auVar92);
                  auVar88 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar92 = vshufps_avx(auVar85,auVar85,0xc9);
                  auVar231 = ZEXT1664(auVar92);
                  auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                  auVar152._0_4_ = auVar85._0_4_ * auVar93._0_4_;
                  auVar152._4_4_ = auVar85._4_4_ * auVar93._4_4_;
                  auVar152._8_4_ = auVar85._8_4_ * auVar93._8_4_;
                  auVar152._12_4_ = auVar85._12_4_ * auVar93._12_4_;
                  auVar93 = vfmsub231ps_fma(auVar152,auVar88,auVar92);
                  auVar88 = vshufps_avx(auVar93,auVar93,0xe9);
                  local_630 = vmovlps_avx(auVar88);
                  local_628 = auVar93._0_4_;
                  local_620 = 0;
                  local_61c = local_92c;
                  local_618 = (undefined4)local_928;
                  local_614 = local_938->user->instID[0];
                  local_610 = local_938->user->instPrimID[0];
                  ray->tfar = fVar202;
                  local_93c = -1;
                  local_6d0.valid = &local_93c;
                  local_6d0.geometryUserPtr = pGVar3->userPtr;
                  local_6d0.context = local_938->user;
                  local_6d0.hit = (RTCHitN *)&local_630;
                  local_6d0.N = 1;
                  local_7a0._0_8_ = pGVar3;
                  local_6d0.ray = (RTCRayN *)ray;
                  local_624 = fVar142;
                  if (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_019d2d72:
                    p_Var4 = local_938->args->filter;
                    if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                       (((local_938->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                      auVar231 = ZEXT1664(auVar231._0_16_);
                      auVar238 = ZEXT1664(auVar238._0_16_);
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      auVar246 = ZEXT1664(auVar246._0_16_);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar254 = ZEXT1664(auVar254._0_16_);
                      (*p_Var4)(&local_6d0);
                      auVar270 = ZEXT3264(local_900);
                      auVar269 = ZEXT3264(local_7c0);
                      auVar268 = ZEXT3264(local_760);
                      auVar267 = ZEXT3264(local_740);
                      auVar266 = ZEXT3264(local_8e0);
                      auVar264 = ZEXT3264(local_8c0);
                      auVar262 = ZEXT3264(local_8a0);
                      auVar261 = ZEXT3264(local_880);
                      auVar260 = ZEXT3264(local_860);
                      auVar259 = ZEXT3264(local_840);
                      auVar258 = ZEXT3264(local_820);
                      auVar257 = ZEXT3264(local_800);
                      auVar263 = ZEXT3264(local_7e0);
                      auVar265 = ZEXT3264(local_720);
                      auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                                    CONCAT424(0x3f800000,
                                                              CONCAT420(0x3f800000,
                                                                        CONCAT416(0x3f800000,
                                                                                  CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                      if (*local_6d0.valid == 0) goto LAB_019d2e39;
                    }
                    bVar75 = 1;
                    goto LAB_019d2afe;
                  }
                  auVar231 = ZEXT1664(auVar92);
                  auVar238 = ZEXT1664(auVar235);
                  auVar242 = ZEXT1664(auVar241);
                  auVar246 = ZEXT1664(auVar87);
                  auVar249 = ZEXT1664(local_700._0_16_);
                  auVar254 = ZEXT1664(local_5e0._0_16_);
                  (*pGVar3->occlusionFilterN)(&local_6d0);
                  auVar270 = ZEXT3264(local_900);
                  auVar269 = ZEXT3264(local_7c0);
                  auVar268 = ZEXT3264(local_760);
                  auVar267 = ZEXT3264(local_740);
                  auVar266 = ZEXT3264(local_8e0);
                  auVar264 = ZEXT3264(local_8c0);
                  auVar262 = ZEXT3264(local_8a0);
                  auVar261 = ZEXT3264(local_880);
                  auVar260 = ZEXT3264(local_860);
                  auVar259 = ZEXT3264(local_840);
                  auVar258 = ZEXT3264(local_820);
                  auVar257 = ZEXT3264(local_800);
                  auVar263 = ZEXT3264(local_7e0);
                  auVar265 = ZEXT3264(local_720);
                  auVar252 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (*local_6d0.valid != 0) goto LAB_019d2d72;
LAB_019d2e39:
                  ray->tfar = (float)local_920._0_4_;
                }
                bVar75 = 0;
                goto LAB_019d2afe;
              }
            }
            uVar77 = uVar77 + 1;
          }
          bVar82 = false;
LAB_019d2afe:
          bVar78 = bVar78 | bVar82 & bVar75;
          fVar142 = ray->tfar;
          auVar73._4_4_ = fStack_37c;
          auVar73._0_4_ = local_380;
          auVar73._8_4_ = fStack_378;
          auVar73._12_4_ = fStack_374;
          auVar73._16_4_ = fStack_370;
          auVar73._20_4_ = fStack_36c;
          auVar73._24_4_ = fStack_368;
          auVar73._28_4_ = fStack_364;
          fVar202 = ray->tfar;
          auVar37._4_4_ = fVar202;
          auVar37._0_4_ = fVar202;
          auVar37._8_4_ = fVar202;
          auVar37._12_4_ = fVar202;
          auVar37._16_4_ = fVar202;
          auVar37._20_4_ = fVar202;
          auVar37._24_4_ = fVar202;
          auVar37._28_4_ = fVar202;
          uVar15 = vcmpps_avx512vl(auVar73,auVar37,2);
        }
        uVar17 = vpcmpd_avx512vl(local_340,local_2a0,1);
        uVar16 = vpcmpd_avx512vl(local_340,_local_3c0,1);
        auVar197._0_4_ = (float)local_3e0._0_4_ + (float)local_2e0._0_4_;
        auVar197._4_4_ = (float)local_3e0._4_4_ + (float)local_2e0._4_4_;
        auVar197._8_4_ = fStack_3d8 + fStack_2d8;
        auVar197._12_4_ = fStack_3d4 + fStack_2d4;
        auVar197._16_4_ = fStack_3d0 + fStack_2d0;
        auVar197._20_4_ = fStack_3cc + fStack_2cc;
        auVar197._24_4_ = fStack_3c8 + fStack_2c8;
        auVar197._28_4_ = fStack_3c4 + fStack_2c4;
        auVar219._4_4_ = fVar142;
        auVar219._0_4_ = fVar142;
        auVar219._8_4_ = fVar142;
        auVar219._12_4_ = fVar142;
        auVar219._16_4_ = fVar142;
        auVar219._20_4_ = fVar142;
        auVar219._24_4_ = fVar142;
        auVar219._28_4_ = fVar142;
        uVar15 = vcmpps_avx512vl(auVar197,auVar219,2);
        bVar79 = (byte)local_764 & (byte)uVar17 & (byte)uVar15;
        auVar198._0_4_ = (float)local_3e0._0_4_ + (float)local_320._0_4_;
        auVar198._4_4_ = (float)local_3e0._4_4_ + (float)local_320._4_4_;
        auVar198._8_4_ = fStack_3d8 + fStack_318;
        auVar198._12_4_ = fStack_3d4 + fStack_314;
        auVar198._16_4_ = fStack_3d0 + fStack_310;
        auVar198._20_4_ = fStack_3cc + fStack_30c;
        auVar198._24_4_ = fStack_3c8 + fStack_308;
        auVar198._28_4_ = fStack_3c4 + fStack_304;
        uVar15 = vcmpps_avx512vl(auVar198,auVar219,2);
        bVar74 = bVar74 & (byte)uVar16 & (byte)uVar15 | bVar79;
        prim = local_5f8;
        pPVar81 = local_600;
        if (bVar74 != 0) {
          abStack_180[uVar76 * 0x60] = bVar74;
          bVar82 = (bool)(bVar79 >> 1 & 1);
          bVar5 = (bool)(bVar79 >> 2 & 1);
          bVar6 = (bool)(bVar79 >> 3 & 1);
          bVar7 = (bool)(bVar79 >> 4 & 1);
          bVar8 = (bool)(bVar79 >> 5 & 1);
          bVar9 = (bool)(bVar79 >> 6 & 1);
          auStack_160[uVar76 * 0x18] =
               (uint)(bVar79 & 1) * local_2e0._0_4_ | (uint)!(bool)(bVar79 & 1) * local_320._0_4_;
          auStack_160[uVar76 * 0x18 + 1] =
               (uint)bVar82 * local_2e0._4_4_ | (uint)!bVar82 * local_320._4_4_;
          auStack_160[uVar76 * 0x18 + 2] =
               (uint)bVar5 * (int)fStack_2d8 | (uint)!bVar5 * (int)fStack_318;
          auStack_160[uVar76 * 0x18 + 3] =
               (uint)bVar6 * (int)fStack_2d4 | (uint)!bVar6 * (int)fStack_314;
          auStack_160[uVar76 * 0x18 + 4] =
               (uint)bVar7 * (int)fStack_2d0 | (uint)!bVar7 * (int)fStack_310;
          auStack_160[uVar76 * 0x18 + 5] =
               (uint)bVar8 * (int)fStack_2cc | (uint)!bVar8 * (int)fStack_30c;
          auStack_160[uVar76 * 0x18 + 6] =
               (uint)bVar9 * (int)fStack_2c8 | (uint)!bVar9 * (int)fStack_308;
          auStack_160[uVar76 * 0x18 + 7] =
               (uint)(bVar79 >> 7) * (int)fStack_2c4 | (uint)!(bool)(bVar79 >> 7) * (int)fStack_304;
          uVar83 = vmovlps_avx(local_350);
          (&uStack_140)[uVar76 * 0xc] = uVar83;
          aiStack_138[uVar76 * 0x18] = local_94c + 1;
          uVar76 = (ulong)((int)uVar76 + 1);
        }
      }
    }
    fVar202 = ray->tfar;
    auVar154._4_4_ = fVar202;
    auVar154._0_4_ = fVar202;
    auVar154._8_4_ = fVar202;
    auVar154._12_4_ = fVar202;
    auVar154._16_4_ = fVar202;
    auVar154._20_4_ = fVar202;
    auVar154._24_4_ = fVar202;
    auVar154._28_4_ = fVar202;
    do {
      uVar84 = (uint)uVar76;
      uVar76 = (ulong)(uVar84 - 1);
      if (uVar84 == 0) {
        if (bVar78 != 0) goto LAB_019d2f9f;
        uVar15 = vcmpps_avx512vl(auVar154,local_280,0xd);
        local_5e8 = (ulong)((uint)local_5f0 & (uint)uVar15);
        goto LAB_019d075f;
      }
      auVar99 = *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x18);
      auVar195._0_4_ = auVar99._0_4_ + (float)local_3e0._0_4_;
      auVar195._4_4_ = auVar99._4_4_ + (float)local_3e0._4_4_;
      auVar195._8_4_ = auVar99._8_4_ + fStack_3d8;
      auVar195._12_4_ = auVar99._12_4_ + fStack_3d4;
      auVar195._16_4_ = auVar99._16_4_ + fStack_3d0;
      auVar195._20_4_ = auVar99._20_4_ + fStack_3cc;
      auVar195._24_4_ = auVar99._24_4_ + fStack_3c8;
      auVar195._28_4_ = auVar99._28_4_ + fStack_3c4;
      uVar15 = vcmpps_avx512vl(auVar195,auVar154,2);
      uVar135 = (uint)uVar15 & (uint)abStack_180[uVar76 * 0x60];
    } while (uVar135 == 0);
    uVar83 = (&uStack_140)[uVar76 * 0xc];
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar83;
    auVar196._8_4_ = 0x7f800000;
    auVar196._0_8_ = 0x7f8000007f800000;
    auVar196._12_4_ = 0x7f800000;
    auVar196._16_4_ = 0x7f800000;
    auVar196._20_4_ = 0x7f800000;
    auVar196._24_4_ = 0x7f800000;
    auVar196._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar196,auVar99);
    bVar74 = (byte)uVar135;
    auVar132._0_4_ =
         (uint)(bVar74 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar74 & 1) * (int)auVar99._0_4_;
    bVar82 = (bool)((byte)(uVar135 >> 1) & 1);
    auVar132._4_4_ = (uint)bVar82 * auVar98._4_4_ | (uint)!bVar82 * (int)auVar99._4_4_;
    bVar82 = (bool)((byte)(uVar135 >> 2) & 1);
    auVar132._8_4_ = (uint)bVar82 * auVar98._8_4_ | (uint)!bVar82 * (int)auVar99._8_4_;
    bVar82 = (bool)((byte)(uVar135 >> 3) & 1);
    auVar132._12_4_ = (uint)bVar82 * auVar98._12_4_ | (uint)!bVar82 * (int)auVar99._12_4_;
    bVar82 = (bool)((byte)(uVar135 >> 4) & 1);
    auVar132._16_4_ = (uint)bVar82 * auVar98._16_4_ | (uint)!bVar82 * (int)auVar99._16_4_;
    bVar82 = (bool)((byte)(uVar135 >> 5) & 1);
    auVar132._20_4_ = (uint)bVar82 * auVar98._20_4_ | (uint)!bVar82 * (int)auVar99._20_4_;
    bVar82 = (bool)((byte)(uVar135 >> 6) & 1);
    auVar132._24_4_ = (uint)bVar82 * auVar98._24_4_ | (uint)!bVar82 * (int)auVar99._24_4_;
    auVar132._28_4_ =
         (uVar135 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar135 >> 7,0) * (int)auVar99._28_4_;
    auVar99 = vshufps_avx(auVar132,auVar132,0xb1);
    auVar99 = vminps_avx(auVar132,auVar99);
    auVar98 = vshufpd_avx(auVar99,auVar99,5);
    auVar99 = vminps_avx(auVar99,auVar98);
    auVar98 = vpermpd_avx2(auVar99,0x4e);
    auVar99 = vminps_avx(auVar99,auVar98);
    uVar15 = vcmpps_avx512vl(auVar132,auVar99,0);
    bVar79 = (byte)uVar15 & bVar74;
    if (bVar79 != 0) {
      uVar135 = (uint)bVar79;
    }
    uVar136 = 0;
    for (; (uVar135 & 1) == 0; uVar135 = uVar135 >> 1 | 0x80000000) {
      uVar136 = uVar136 + 1;
    }
    local_94c = aiStack_138[uVar76 * 0x18];
    bVar74 = ~('\x01' << ((byte)uVar136 & 0x1f)) & bVar74;
    abStack_180[uVar76 * 0x60] = bVar74;
    if (bVar74 == 0) {
      uVar84 = uVar84 - 1;
    }
    uVar144 = (undefined4)uVar83;
    auVar176._4_4_ = uVar144;
    auVar176._0_4_ = uVar144;
    auVar176._8_4_ = uVar144;
    auVar176._12_4_ = uVar144;
    auVar176._16_4_ = uVar144;
    auVar176._20_4_ = uVar144;
    auVar176._24_4_ = uVar144;
    auVar176._28_4_ = uVar144;
    auVar87 = vmovshdup_avx(auVar146);
    auVar87 = vsubps_avx(auVar87,auVar146);
    auVar155._0_4_ = auVar87._0_4_;
    auVar155._4_4_ = auVar155._0_4_;
    auVar155._8_4_ = auVar155._0_4_;
    auVar155._12_4_ = auVar155._0_4_;
    auVar155._16_4_ = auVar155._0_4_;
    auVar155._20_4_ = auVar155._0_4_;
    auVar155._24_4_ = auVar155._0_4_;
    auVar155._28_4_ = auVar155._0_4_;
    auVar87 = vfmadd132ps_fma(auVar155,auVar176,_DAT_01f7b040);
    _local_2e0 = ZEXT1632(auVar87);
    local_350._8_8_ = 0;
    local_350._0_8_ = *(ulong *)(local_2e0 + (ulong)uVar136 * 4);
    uVar76 = (ulong)uVar84;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }